

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult(secp256k1_ecmult_context *ctx,secp256k1_gej *r,secp256k1_gej *a,
                     secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *psVar2;
  uint64_t *puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar980 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [16];
  undefined1 auVar990 [16];
  undefined1 auVar991 [16];
  undefined1 auVar992 [16];
  undefined1 auVar993 [16];
  undefined1 auVar994 [16];
  undefined1 auVar995 [16];
  undefined1 auVar996 [16];
  undefined1 auVar997 [16];
  undefined1 auVar998 [16];
  undefined1 auVar999 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1047 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1056 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1060 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1103 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1112 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1122 [16];
  uint64_t uVar1123;
  uint64_t uVar1124;
  uint64_t uVar1125;
  bool bVar1126;
  undefined8 uVar1127;
  undefined8 uVar1128;
  undefined4 in_EAX;
  int iVar1129;
  uint uVar1130;
  uint uVar1131;
  ulong uVar1132;
  ulong uVar1133;
  long lVar1134;
  ulong uVar1135;
  ulong uVar1136;
  ulong uVar1137;
  ulong uVar1138;
  ulong uVar1139;
  ulong uVar1140;
  ulong uVar1141;
  ulong uVar1142;
  ulong uVar1143;
  ulong uVar1144;
  ulong uVar1145;
  ulong *puVar1146;
  ulong uVar1147;
  ulong uVar1148;
  ulong uVar1149;
  secp256k1_gej *psVar1150;
  secp256k1_ge *psVar1151;
  ulong uVar1152;
  secp256k1_ge *psVar1153;
  ulong uVar1154;
  ulong uVar1155;
  ulong uVar1156;
  ulong uVar1157;
  ulong uVar1158;
  ulong uVar1159;
  ulong uVar1160;
  uint64_t uVar1161;
  ulong uVar1162;
  long lVar1163;
  byte bVar1164;
  long lVar1165;
  undefined1 auVar1166 [16];
  long lVar1168;
  undefined1 auVar1167 [16];
  long lVar1169;
  long lVar1170;
  uint64_t tmp3_7;
  uint64_t tmp2_15;
  uint64_t tmp3;
  secp256k1_fe s1;
  secp256k1_fe t;
  uint64_t tmp1_9;
  secp256k1_fe u2;
  uint64_t tmp1_1;
  secp256k1_fe Z;
  uint64_t tmp2_11;
  uint64_t tmp2;
  uint64_t tmp2_9;
  uint64_t tmp1;
  secp256k1_fe i2;
  secp256k1_fe s2;
  secp256k1_fe h2;
  secp256k1_fe zr [8];
  int wnaf_ng [256];
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_fe local_12a8;
  ulong local_1280;
  ulong local_1278;
  ulong local_1270;
  ulong local_1268;
  long lStack_1260;
  secp256k1_ge local_1258;
  ulong local_11f8;
  undefined1 auStack_11f0 [16];
  undefined1 local_11e0 [16];
  ulong local_11c8;
  ulong uStack_11c0;
  ulong local_11b8;
  ulong uStack_11b0;
  long local_11a8;
  ulong local_11a0;
  ulong local_1198;
  ulong local_1190;
  ulong local_1188;
  ulong local_1180;
  ulong local_1178;
  ulong local_1170;
  ulong local_1168;
  ulong local_1160;
  ulong local_1158;
  uint64_t *local_1150;
  secp256k1_ecmult_context *local_1148;
  ulong local_1140;
  ulong local_1138;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  secp256k1_fe local_1118;
  ulong local_10f0;
  ulong local_10e8;
  ulong local_10e0;
  ulong local_10d8;
  ulong local_10d0;
  ulong local_10c8;
  ulong uStack_10c0;
  ulong local_10b8;
  ulong uStack_10b0;
  long local_10a8;
  ulong local_1098;
  ulong local_1090;
  ulong local_1088;
  ulong local_1080;
  long lStack_1078;
  ulong local_1070;
  ulong local_1068;
  ulong local_1060;
  ulong local_1058;
  ulong local_1050;
  secp256k1_fe local_1048 [7];
  ulong local_f30;
  ulong uStack_f28;
  undefined1 local_f20 [16];
  undefined8 local_f10;
  undefined1 local_f08 [24];
  ulong uStack_ef0;
  ulong local_ee8;
  ulong local_ee0;
  ulong uStack_ed8;
  ulong local_ed0;
  ulong uStack_ec8;
  ulong local_ec0;
  secp256k1_fe local_eb8 [23];
  secp256k1_ge local_b08 [6];
  secp256k1_ge local_8f8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  secp256k1_fe local_878;
  undefined4 local_850;
  secp256k1_gej local_848 [6];
  secp256k1_gej local_548;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  uint64_t local_4a0;
  uint64_t uStack_498;
  uint64_t local_490;
  uint64_t uStack_488;
  uint64_t local_480;
  ulong local_478;
  ulong uStack_470;
  ulong local_468;
  ulong uStack_460;
  ulong local_458;
  uint auStack_44c [257];
  uint local_48;
  long local_40;
  
  bVar1164 = 0;
  auVar1166._0_4_ = -(uint)((int)na->d[2] == 0 && (int)na->d[0] == 0);
  auVar1166._4_4_ = -(uint)(*(int *)((long)na->d + 0x14) == 0 && *(int *)((long)na->d + 4) == 0);
  auVar1166._8_4_ = -(uint)((int)na->d[3] == 0 && (int)na->d[1] == 0);
  auVar1166._12_4_ = -(uint)(*(int *)((long)na->d + 0x1c) == 0 && *(int *)((long)na->d + 0xc) == 0);
  iVar1129 = movmskps(in_EAX,auVar1166);
  local_1148 = ctx;
  if ((iVar1129 == 0xf) || (a->infinity != 0)) {
    local_11f8 = 1;
    auStack_11f0 = (undefined1  [16])0x0;
    local_11e0 = (undefined1  [16])0x0;
    bVar1126 = true;
    uVar1130 = 0;
  }
  else {
    local_40 = 0;
    uVar1130 = secp256k1_ecmult_wnaf
                         ((int *)(auStack_44c + 1),(int)na,(secp256k1_scalar *)0x5,(int)na);
    lVar1163 = local_40;
    psVar1150 = a + local_40;
    local_48 = uVar1130;
    secp256k1_gej_double_var((secp256k1_gej *)local_f08,psVar1150,(secp256k1_fe *)0x0);
    local_1258.x.n[4] = local_ee8;
    local_1258.x.n[2] = local_f08._16_8_;
    local_1258.x.n[3] = uStack_ef0;
    local_1258.x.n[0] = local_f08._0_8_;
    local_1258.x.n[1] = local_f08._8_8_;
    local_1258.y.n[0] = local_ee0;
    local_1258.y.n[1] = uStack_ed8;
    local_1258.y.n[2] = local_ed0;
    local_1258.y.n[3] = uStack_ec8;
    local_1258.y.n[4] = local_ec0;
    local_1258.infinity = 0;
    secp256k1_ge_set_gej_zinv(local_b08,psVar1150,local_eb8);
    local_848[0].x.n[4] = local_b08[0].x.n[4];
    local_848[0].x.n[2] = local_b08[0].x.n[2];
    local_848[0].x.n[3] = local_b08[0].x.n[3];
    local_848[0].x.n[0] = local_b08[0].x.n[0];
    local_848[0].x.n[1] = local_b08[0].x.n[1];
    local_848[0].y.n[0] = local_b08[0].y.n[0];
    local_848[0].y.n[1] = local_b08[0].y.n[1];
    local_848[0].y.n[2] = local_b08[0].y.n[2];
    local_848[0].y.n[3] = local_b08[0].y.n[3];
    local_848[0].y.n[4] = local_b08[0].y.n[4];
    local_848[0].z.n[0] = a[lVar1163].z.n[0];
    local_848[0].z.n[1] = a[lVar1163].z.n[1];
    puVar3 = a[lVar1163].z.n + 2;
    local_848[0].z.n[2] = *puVar3;
    local_848[0].z.n[3] = puVar3[1];
    local_848[0].z.n[4] = a[lVar1163].z.n[4];
    local_848[0].infinity = 0;
    local_1048[0].n[4] = local_eb8[0].n[4];
    local_1048[0].n[2] = local_eb8[0].n[2];
    local_1048[0].n[3] = local_eb8[0].n[3];
    local_1048[0].n[0] = local_eb8[0].n[0];
    local_1048[0].n[1] = local_eb8[0].n[1];
    lVar1163 = 0x28;
    psVar1150 = local_848;
    do {
      secp256k1_gej_add_ge_var
                (psVar1150 + 1,psVar1150,&local_1258,
                 (secp256k1_fe *)((long)local_1048[0].n + lVar1163));
      lVar1163 = lVar1163 + 0x28;
      psVar1150 = psVar1150 + 1;
    } while (lVar1163 != 0x140);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_eb8[0].n[0];
    auVar535._8_8_ = 0;
    auVar535._0_8_ = uStack_460;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_eb8[0].n[1];
    auVar536._8_8_ = 0;
    auVar536._0_8_ = local_468;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_eb8[0].n[2];
    auVar537._8_8_ = 0;
    auVar537._0_8_ = uStack_470;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_eb8[0].n[3];
    auVar538._8_8_ = 0;
    auVar538._0_8_ = local_478;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_eb8[0].n[4];
    auVar539._8_8_ = 0;
    auVar539._0_8_ = local_458;
    uVar1141 = SUB168(auVar9 * auVar539,0);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar1141 & 0xfffffffffffff;
    auVar1166 = auVar6 * auVar536 + auVar5 * auVar535 + auVar7 * auVar537 + auVar8 * auVar538 +
                auVar10 * ZEXT816(0x1000003d10);
    uVar1149 = auVar1166._0_8_;
    local_10f0 = uVar1149 & 0xfffffffffffff;
    auVar989._8_8_ = 0;
    auVar989._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_eb8[0].n[0];
    auVar540._8_8_ = 0;
    auVar540._0_8_ = local_458;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_eb8[0].n[1];
    auVar541._8_8_ = 0;
    auVar541._0_8_ = uStack_460;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_eb8[0].n[2];
    auVar542._8_8_ = 0;
    auVar542._0_8_ = local_468;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_eb8[0].n[3];
    auVar543._8_8_ = 0;
    auVar543._0_8_ = uStack_470;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_eb8[0].n[4];
    auVar544._8_8_ = 0;
    auVar544._0_8_ = local_478;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar1141 >> 0x34 | SUB168(auVar9 * auVar539,8) << 0xc;
    auVar1166 = auVar11 * auVar540 + auVar989 + auVar12 * auVar541 + auVar13 * auVar542 +
                auVar14 * auVar543 + auVar15 * auVar544 + auVar16 * ZEXT816(0x1000003d10);
    uVar1141 = auVar1166._0_8_;
    auVar990._8_8_ = 0;
    auVar990._0_8_ = uVar1141 >> 0x34 | auVar1166._8_8_ << 0xc;
    local_1140 = uVar1141 & 0xffffffffffff;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_eb8[0].n[0];
    auVar545._8_8_ = 0;
    auVar545._0_8_ = local_478;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_eb8[0].n[1];
    auVar546._8_8_ = 0;
    auVar546._0_8_ = local_458;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_eb8[0].n[2];
    auVar547._8_8_ = 0;
    auVar547._0_8_ = uStack_460;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_eb8[0].n[3];
    auVar548._8_8_ = 0;
    auVar548._0_8_ = local_468;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_eb8[0].n[4];
    auVar549._8_8_ = 0;
    auVar549._0_8_ = uStack_470;
    auVar1166 = auVar18 * auVar546 + auVar990 + auVar19 * auVar547 + auVar20 * auVar548 +
                auVar21 * auVar549;
    uVar1149 = auVar1166._0_8_;
    auVar992._8_8_ = 0;
    auVar992._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
    auVar550._8_8_ = 0;
    auVar550._0_8_ = (uVar1149 & 0xfffffffffffff) << 4 | (uVar1141 & 0xfffffffffffff) >> 0x30;
    auVar1166 = auVar17 * auVar545 + ZEXT816(0x1000003d1) * auVar550;
    uVar1149 = auVar1166._0_8_;
    auVar991._8_8_ = 0;
    auVar991._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_eb8[0].n[0];
    auVar551._8_8_ = 0;
    auVar551._0_8_ = uStack_470;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_eb8[0].n[1];
    auVar552._8_8_ = 0;
    auVar552._0_8_ = local_478;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_eb8[0].n[2];
    auVar553._8_8_ = 0;
    auVar553._0_8_ = local_458;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_eb8[0].n[3];
    auVar554._8_8_ = 0;
    auVar554._0_8_ = uStack_460;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_eb8[0].n[4];
    auVar555._8_8_ = 0;
    auVar555._0_8_ = local_468;
    auVar5 = auVar24 * auVar553 + auVar992 + auVar25 * auVar554 + auVar26 * auVar555;
    uVar1141 = auVar5._0_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar1141 & 0xfffffffffffff;
    auVar1166 = auVar22 * auVar551 + auVar991 + auVar23 * auVar552 + auVar27 * ZEXT816(0x1000003d10)
    ;
    uVar1132 = auVar1166._0_8_;
    auVar994._8_8_ = 0;
    auVar994._0_8_ = uVar1141 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar993._8_8_ = 0;
    auVar993._0_8_ = uVar1132 >> 0x34 | auVar1166._8_8_ << 0xc;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_eb8[0].n[0];
    auVar556._8_8_ = 0;
    auVar556._0_8_ = local_468;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_eb8[0].n[1];
    auVar557._8_8_ = 0;
    auVar557._0_8_ = uStack_470;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_eb8[0].n[2];
    auVar558._8_8_ = 0;
    auVar558._0_8_ = local_478;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_eb8[0].n[3];
    auVar559._8_8_ = 0;
    auVar559._0_8_ = local_458;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_eb8[0].n[4];
    auVar560._8_8_ = 0;
    auVar560._0_8_ = uStack_460;
    auVar5 = auVar31 * auVar559 + auVar994 + auVar32 * auVar560;
    uVar1141 = auVar5._0_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar1141 & 0xfffffffffffff;
    auVar1166 = auVar28 * auVar556 + auVar993 + auVar29 * auVar557 + auVar30 * auVar558 +
                auVar33 * ZEXT816(0x1000003d10);
    uVar1147 = auVar1166._0_8_;
    na = (secp256k1_scalar *)(uVar1141 >> 0x34 | auVar5._8_8_ << 0xc);
    local_468 = uVar1147 & 0xfffffffffffff;
    auVar995._8_8_ = 0;
    auVar995._0_8_ = (uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc) + local_10f0;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = na;
    auVar995 = auVar34 * ZEXT816(0x1000003d10) + auVar995;
    uVar1141 = auVar995._0_8_;
    uStack_460 = uVar1141 & 0xfffffffffffff;
    local_458 = (uVar1141 >> 0x34 | auVar995._8_8_ << 0xc) + local_1140;
    local_8a0 = local_4c8;
    uStack_898 = uStack_4c0;
    local_890 = local_4b8;
    uStack_888 = uStack_4b0;
    local_880 = local_4a8;
    local_878.n[0] = local_4a0;
    local_878.n[1] = uStack_498;
    local_878.n[2] = local_490;
    local_878.n[3] = uStack_488;
    local_878.n[4] = local_480;
    local_478 = uVar1149 & 0xfffffffffffff;
    uStack_470 = uVar1132 & 0xfffffffffffff;
    secp256k1_fe_normalize_weak(&local_878);
    local_11e0._8_8_ = local_458;
    local_11e0._0_8_ = uStack_460;
    local_11f8 = local_478;
    auStack_11f0._8_8_ = local_468;
    auStack_11f0._0_8_ = uStack_470;
    local_850 = 0;
    local_f08._0_8_ = local_f30;
    local_f08._8_8_ = uStack_f28;
    stack0xfffffffffffff108 = local_f20;
    local_ee8 = local_f10;
    psVar1150 = &local_548;
    lVar1163 = 0x118;
    psVar1151 = &local_8f8;
    do {
      uVar1128 = local_f08._8_8_;
      uVar1127 = local_f08._0_8_;
      if (lVar1163 != 0x118) {
        puVar1146 = (ulong *)((long)local_1048[0].n + lVar1163);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *puVar1146;
        auVar561._8_8_ = 0;
        auVar561._0_8_ = uStack_ef0;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 8);
        auVar562._8_8_ = 0;
        auVar562._0_8_ = local_f08._16_8_;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x10);
        auVar563._8_8_ = 0;
        auVar563._0_8_ = local_f08._8_8_;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x18);
        auVar564._8_8_ = 0;
        auVar564._0_8_ = local_f08._0_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x20);
        auVar565._8_8_ = 0;
        auVar565._0_8_ = local_ee8;
        uVar1141 = SUB168(auVar39 * auVar565,0);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar1141 & 0xfffffffffffff;
        auVar1166 = auVar36 * auVar562 + auVar35 * auVar561 + auVar37 * auVar563 +
                    auVar38 * auVar564 + auVar40 * ZEXT816(0x1000003d10);
        uVar1149 = auVar1166._0_8_;
        local_1258.x.n[0] = uVar1149 & 0xfffffffffffff;
        auVar996._8_8_ = 0;
        auVar996._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *puVar1146;
        auVar566._8_8_ = 0;
        auVar566._0_8_ = local_ee8;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 8);
        auVar567._8_8_ = 0;
        auVar567._0_8_ = uStack_ef0;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x10);
        auVar568._8_8_ = 0;
        auVar568._0_8_ = local_f08._16_8_;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x18);
        auVar569._8_8_ = 0;
        auVar569._0_8_ = local_f08._8_8_;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x20);
        auVar570._8_8_ = 0;
        auVar570._0_8_ = local_f08._0_8_;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar1141 >> 0x34 | SUB168(auVar39 * auVar565,8) << 0xc;
        auVar1166 = auVar41 * auVar566 + auVar996 + auVar42 * auVar567 + auVar43 * auVar568 +
                    auVar44 * auVar569 + auVar45 * auVar570 + auVar46 * ZEXT816(0x1000003d10);
        local_10f0 = auVar1166._0_8_;
        auVar997._8_8_ = 0;
        auVar997._0_8_ = local_10f0 >> 0x34 | auVar1166._8_8_ << 0xc;
        local_1140 = (local_10f0 & 0xfffffffffffff) >> 0x30;
        local_10f0 = local_10f0 & 0xffffffffffff;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *puVar1146;
        auVar571._8_8_ = 0;
        auVar571._0_8_ = local_f08._0_8_;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 8);
        auVar572._8_8_ = 0;
        auVar572._0_8_ = local_ee8;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x10);
        auVar573._8_8_ = 0;
        auVar573._0_8_ = uStack_ef0;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x18);
        auVar574._8_8_ = 0;
        auVar574._0_8_ = local_f08._16_8_;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x20);
        auVar575._8_8_ = 0;
        auVar575._0_8_ = local_f08._8_8_;
        auVar1166 = auVar48 * auVar572 + auVar997 + auVar49 * auVar573 + auVar50 * auVar574 +
                    auVar51 * auVar575;
        uVar1141 = auVar1166._0_8_;
        auVar999._8_8_ = 0;
        auVar999._0_8_ = uVar1141 >> 0x34 | auVar1166._8_8_ << 0xc;
        auVar576._8_8_ = 0;
        auVar576._0_8_ = (uVar1141 & 0xfffffffffffff) << 4 | local_1140;
        uVar1141 = auVar175._0_8_;
        auVar175 = auVar47 * auVar571 + ZEXT816(0x1000003d1) * auVar576;
        local_f08._0_8_ = uVar1141 & 0xfffffffffffff;
        auVar998._8_8_ = 0;
        auVar998._0_8_ = uVar1141 >> 0x34 | auVar175._8_8_ << 0xc;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *puVar1146;
        auVar577._8_8_ = 0;
        auVar577._0_8_ = local_f08._8_8_;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 8);
        auVar578._8_8_ = 0;
        auVar578._0_8_ = uVar1127;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x10);
        auVar579._8_8_ = 0;
        auVar579._0_8_ = local_ee8;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x18);
        auVar580._8_8_ = 0;
        auVar580._0_8_ = uStack_ef0;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x20);
        auVar581._8_8_ = 0;
        auVar581._0_8_ = local_f08._16_8_;
        auVar5 = auVar54 * auVar579 + auVar999 + auVar55 * auVar580 + auVar56 * auVar581;
        uVar1141 = auVar5._0_8_;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar1141 & 0xfffffffffffff;
        auVar1166 = auVar52 * auVar577 + auVar998 + auVar53 * auVar578 +
                    auVar57 * ZEXT816(0x1000003d10);
        uVar1149 = auVar1166._0_8_;
        auVar1001._8_8_ = 0;
        auVar1001._0_8_ = uVar1141 >> 0x34 | auVar5._8_8_ << 0xc;
        local_f08._8_8_ = uVar1149 & 0xfffffffffffff;
        auVar1000._8_8_ = 0;
        auVar1000._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *puVar1146;
        auVar582._8_8_ = 0;
        auVar582._0_8_ = local_f08._16_8_;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 8);
        auVar583._8_8_ = 0;
        auVar583._0_8_ = uVar1128;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x10);
        auVar584._8_8_ = 0;
        auVar584._0_8_ = uVar1127;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x18);
        auVar585._8_8_ = 0;
        auVar585._0_8_ = local_ee8;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = *(ulong *)((long)local_1048[0].n + lVar1163 + 0x20);
        auVar586._8_8_ = 0;
        auVar586._0_8_ = uStack_ef0;
        auVar5 = auVar61 * auVar585 + auVar1001 + auVar62 * auVar586;
        uVar1141 = auVar5._0_8_;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar1141 & 0xfffffffffffff;
        auVar1166 = auVar58 * auVar582 + auVar1000 + auVar59 * auVar583 + auVar60 * auVar584 +
                    auVar63 * ZEXT816(0x1000003d10);
        uVar1149 = auVar1166._0_8_;
        na = (secp256k1_scalar *)(uVar1141 >> 0x34 | auVar5._8_8_ << 0xc);
        auVar1002._8_8_ = 0;
        auVar1002._0_8_ = (uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc) + local_1258.x.n[0];
        auVar64._8_8_ = 0;
        auVar64._0_8_ = na;
        auVar1002 = auVar64 * ZEXT816(0x1000003d10) + auVar1002;
        uVar1141 = auVar1002._0_8_;
        uStack_ef0 = uVar1141 & 0xfffffffffffff;
        local_f08._16_8_ = uVar1149 & 0xfffffffffffff;
        local_ee8 = (uVar1141 >> 0x34 | auVar1002._8_8_ << 0xc) + local_10f0;
      }
      secp256k1_ge_set_gej_zinv(psVar1151,psVar1150,(secp256k1_fe *)local_f08);
      psVar1150 = psVar1150 + -1;
      psVar1151 = psVar1151 + -1;
      lVar1163 = lVar1163 + -0x28;
    } while (lVar1163 != 0);
    bVar1126 = false;
    if ((int)uVar1130 < 1) {
      uVar1130 = 0;
    }
  }
  if (ng == (secp256k1_scalar *)0x0) {
    lVar1163 = 0;
  }
  else {
    uVar1131 = secp256k1_ecmult_wnaf((int *)local_f08,(int)ng,(secp256k1_scalar *)0xf,(int)na);
    if ((int)uVar1130 < (int)uVar1131) {
      uVar1130 = uVar1131;
    }
    lVar1163 = (long)(int)uVar1131;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (uVar1130 != 0) {
    psVar1 = &r->y;
    psVar2 = &r->z;
    local_1150 = (r->z).n + 1;
    uVar1141 = (ulong)uVar1130;
    do {
      secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
      if (((long)uVar1141 <= (long)(int)local_48 && !bVar1126) &&
         (uVar1130 = auStack_44c[uVar1141], uVar1130 != 0)) {
        if ((int)uVar1130 < 1) {
          psVar1151 = local_b08 + (~uVar1130 >> 1);
          psVar1153 = &local_1258;
          for (lVar1134 = 0xb; lVar1134 != 0; lVar1134 = lVar1134 + -1) {
            (psVar1153->x).n[0] = (psVar1151->x).n[0];
            psVar1151 = (secp256k1_ge *)((long)psVar1151 + ((ulong)bVar1164 * -2 + 1) * 8);
            psVar1153 = (secp256k1_ge *)((long)psVar1153 + ((ulong)bVar1164 * -2 + 1) * 8);
          }
          local_1258.y.n[0] = 0x3ffffbfffff0bc - local_1258.y.n[0];
          local_1258.y.n[1] = 0x3ffffffffffffc - local_1258.y.n[1];
          local_1258.y.n[2] = 0x3ffffffffffffc - local_1258.y.n[2];
          local_1258.y.n[3] = 0x3ffffffffffffc - local_1258.y.n[3];
          local_1258.y.n[4] = 0x3fffffffffffc - local_1258.y.n[4];
        }
        else {
          psVar1151 = local_b08 + (uVar1130 - 1 >> 1);
          psVar1153 = &local_1258;
          for (lVar1134 = 0xb; lVar1134 != 0; lVar1134 = lVar1134 + -1) {
            (psVar1153->x).n[0] = (psVar1151->x).n[0];
            psVar1151 = (secp256k1_ge *)((long)psVar1151 + ((ulong)bVar1164 * -2 + 1) * 8);
            psVar1153 = (secp256k1_ge *)((long)psVar1153 + ((ulong)bVar1164 * -2 + 1) * 8);
          }
        }
        secp256k1_gej_add_ge_var(r,r,&local_1258,(secp256k1_fe *)0x0);
      }
      if (((long)uVar1141 <= lVar1163) &&
         (uVar1130 = *(uint *)((long)&local_f10 + uVar1141 * 4 + 4), uVar1130 != 0)) {
        if ((int)uVar1130 < 1) {
          secp256k1_ge_from_storage
                    (&local_1258,
                     (secp256k1_ge_storage *)(local_1148->pre_g + (ulong)(~uVar1130 >> 1) * 0x40));
          local_1258.y.n[0] = 0x3ffffbfffff0bc - local_1258.y.n[0];
          local_1258.y.n[1] = 0x3ffffffffffffc - local_1258.y.n[1];
          local_1258.y.n[2] = 0x3ffffffffffffc - local_1258.y.n[2];
          local_1258.y.n[3] = 0x3ffffffffffffc - local_1258.y.n[3];
          local_1258.y.n[4] = 0x3fffffffffffc - local_1258.y.n[4];
        }
        else {
          secp256k1_ge_from_storage
                    (&local_1258,
                     (secp256k1_ge_storage *)(local_1148->pre_g + (ulong)(uVar1130 - 1 >> 1) * 0x40)
                    );
        }
        if (local_1258.infinity == 0) {
          if (r->infinity == 0) {
            uVar1149 = psVar2->n[0];
            uVar1132 = (r->z).n[1];
            uVar1147 = (r->z).n[2];
            uVar1148 = (r->z).n[3];
            uVar1154 = (r->z).n[4];
            auVar175._8_8_ = 0;
            auVar175._0_8_ = local_11f8;
            auVar681._8_8_ = 0;
            auVar681._0_8_ = uVar1148;
            auVar176._8_8_ = 0;
            auVar176._0_8_ = auStack_11f0._0_8_;
            auVar682._8_8_ = 0;
            auVar682._0_8_ = uVar1147;
            auVar177._8_8_ = 0;
            auVar177._0_8_ = auStack_11f0._8_8_;
            auVar683._8_8_ = 0;
            auVar683._0_8_ = uVar1132;
            auVar178._8_8_ = 0;
            auVar178._0_8_ = local_11e0._0_8_;
            auVar684._8_8_ = 0;
            auVar684._0_8_ = uVar1149;
            auVar179._8_8_ = 0;
            auVar179._0_8_ = local_11e0._8_8_;
            auVar685._8_8_ = 0;
            auVar685._0_8_ = uVar1154;
            uVar1139 = SUB168(auVar179 * auVar685,0);
            auVar180._8_8_ = 0;
            auVar180._0_8_ = uVar1139 & 0xfffffffffffff;
            auVar175 = auVar176 * auVar682 + auVar175 * auVar681 + auVar177 * auVar683 +
                       auVar178 * auVar684 + auVar180 * ZEXT816(0x1000003d10);
            uVar1140 = auVar175._0_8_;
            auVar1031._8_8_ = 0;
            auVar1031._0_8_ = uVar1140 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar181._8_8_ = 0;
            auVar181._0_8_ = local_11f8;
            auVar686._8_8_ = 0;
            auVar686._0_8_ = uVar1154;
            auVar182._8_8_ = 0;
            auVar182._0_8_ = auStack_11f0._0_8_;
            auVar687._8_8_ = 0;
            auVar687._0_8_ = uVar1148;
            auVar183._8_8_ = 0;
            auVar183._0_8_ = auStack_11f0._8_8_;
            auVar688._8_8_ = 0;
            auVar688._0_8_ = uVar1147;
            auVar184._8_8_ = 0;
            auVar184._0_8_ = local_11e0._0_8_;
            auVar689._8_8_ = 0;
            auVar689._0_8_ = uVar1132;
            auVar185._8_8_ = 0;
            auVar185._0_8_ = local_11e0._8_8_;
            auVar690._8_8_ = 0;
            auVar690._0_8_ = uVar1149;
            auVar186._8_8_ = 0;
            auVar186._0_8_ = uVar1139 >> 0x34 | SUB168(auVar179 * auVar685,8) << 0xc;
            auVar175 = auVar181 * auVar686 + auVar1031 + auVar182 * auVar687 + auVar183 * auVar688 +
                       auVar184 * auVar689 + auVar185 * auVar690 + auVar186 * ZEXT816(0x1000003d10);
            uVar1139 = auVar175._0_8_;
            auVar1032._8_8_ = 0;
            auVar1032._0_8_ = uVar1139 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar187._8_8_ = 0;
            auVar187._0_8_ = local_11f8;
            auVar691._8_8_ = 0;
            auVar691._0_8_ = uVar1149;
            auVar188._8_8_ = 0;
            auVar188._0_8_ = auStack_11f0._0_8_;
            auVar692._8_8_ = 0;
            auVar692._0_8_ = uVar1154;
            auVar189._8_8_ = 0;
            auVar189._0_8_ = auStack_11f0._8_8_;
            auVar693._8_8_ = 0;
            auVar693._0_8_ = uVar1148;
            auVar190._8_8_ = 0;
            auVar190._0_8_ = local_11e0._0_8_;
            auVar694._8_8_ = 0;
            auVar694._0_8_ = uVar1147;
            auVar191._8_8_ = 0;
            auVar191._0_8_ = local_11e0._8_8_;
            auVar695._8_8_ = 0;
            auVar695._0_8_ = uVar1132;
            auVar175 = auVar188 * auVar692 + auVar1032 + auVar189 * auVar693 + auVar190 * auVar694 +
                       auVar191 * auVar695;
            uVar1162 = auVar175._0_8_;
            auVar1034._8_8_ = 0;
            auVar1034._0_8_ = uVar1162 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar696._8_8_ = 0;
            auVar696._0_8_ =
                 (uVar1162 & 0xfffffffffffff) << 4 | (uVar1139 & 0xfffffffffffff) >> 0x30;
            auVar175 = auVar187 * auVar691 + ZEXT816(0x1000003d1) * auVar696;
            uVar1162 = auVar175._0_8_;
            local_10f0 = uVar1162 & 0xfffffffffffff;
            auVar1033._8_8_ = 0;
            auVar1033._0_8_ = uVar1162 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar192._8_8_ = 0;
            auVar192._0_8_ = local_11f8;
            auVar697._8_8_ = 0;
            auVar697._0_8_ = uVar1132;
            auVar193._8_8_ = 0;
            auVar193._0_8_ = auStack_11f0._0_8_;
            auVar698._8_8_ = 0;
            auVar698._0_8_ = uVar1149;
            auVar194._8_8_ = 0;
            auVar194._0_8_ = auStack_11f0._8_8_;
            auVar699._8_8_ = 0;
            auVar699._0_8_ = uVar1154;
            auVar195._8_8_ = 0;
            auVar195._0_8_ = local_11e0._0_8_;
            auVar700._8_8_ = 0;
            auVar700._0_8_ = uVar1148;
            auVar196._8_8_ = 0;
            auVar196._0_8_ = local_11e0._8_8_;
            auVar701._8_8_ = 0;
            auVar701._0_8_ = uVar1147;
            auVar1166 = auVar194 * auVar699 + auVar1034 + auVar195 * auVar700 + auVar196 * auVar701;
            uVar1162 = auVar1166._0_8_;
            auVar197._8_8_ = 0;
            auVar197._0_8_ = uVar1162 & 0xfffffffffffff;
            auVar175 = auVar192 * auVar697 + auVar1033 + auVar193 * auVar698 +
                       auVar197 * ZEXT816(0x1000003d10);
            uVar1155 = auVar175._0_8_;
            auVar1036._8_8_ = 0;
            auVar1036._0_8_ = uVar1162 >> 0x34 | auVar1166._8_8_ << 0xc;
            local_10e8 = uVar1155 & 0xfffffffffffff;
            auVar1035._8_8_ = 0;
            auVar1035._0_8_ = uVar1155 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar198._8_8_ = 0;
            auVar198._0_8_ = local_11f8;
            auVar702._8_8_ = 0;
            auVar702._0_8_ = uVar1147;
            auVar199._8_8_ = 0;
            auVar199._0_8_ = auStack_11f0._0_8_;
            auVar703._8_8_ = 0;
            auVar703._0_8_ = uVar1132;
            auVar200._8_8_ = 0;
            auVar200._0_8_ = auStack_11f0._8_8_;
            auVar704._8_8_ = 0;
            auVar704._0_8_ = uVar1149;
            auVar201._8_8_ = 0;
            auVar201._0_8_ = local_11e0._0_8_;
            auVar705._8_8_ = 0;
            auVar705._0_8_ = uVar1154;
            auVar202._8_8_ = 0;
            auVar202._0_8_ = local_11e0._8_8_;
            auVar706._8_8_ = 0;
            auVar706._0_8_ = uVar1148;
            auVar1166 = auVar201 * auVar705 + auVar1036 + auVar202 * auVar706;
            uVar1149 = auVar1166._0_8_;
            auVar203._8_8_ = 0;
            auVar203._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar198 * auVar702 + auVar1035 + auVar199 * auVar703 + auVar200 * auVar704 +
                       auVar203 * ZEXT816(0x1000003d10);
            uVar1132 = auVar175._0_8_;
            local_10e0 = uVar1132 & 0xfffffffffffff;
            auVar1037._8_8_ = 0;
            auVar1037._0_8_ =
                 (uVar1132 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1140 & 0xfffffffffffff);
            auVar204._8_8_ = 0;
            auVar204._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
            auVar1037 = auVar204 * ZEXT816(0x1000003d10) + auVar1037;
            uVar1149 = auVar1037._0_8_;
            local_10d8 = uVar1149 & 0xfffffffffffff;
            local_10d0 = (uVar1149 >> 0x34 | auVar1037._8_8_ << 0xc) + (uVar1139 & 0xffffffffffff);
            auVar205._8_8_ = 0;
            auVar205._0_8_ = local_10f0 * 2;
            auVar707._8_8_ = 0;
            auVar707._0_8_ = local_10d8;
            auVar206._8_8_ = 0;
            auVar206._0_8_ = local_10e8 * 2;
            auVar708._8_8_ = 0;
            auVar708._0_8_ = local_10e0;
            auVar207._8_8_ = 0;
            auVar207._0_8_ = local_10d0;
            auVar709._8_8_ = 0;
            auVar709._0_8_ = local_10d0;
            uVar1132 = SUB168(auVar207 * auVar709,0);
            auVar208._8_8_ = 0;
            auVar208._0_8_ = uVar1132 & 0xfffffffffffff;
            auVar175 = auVar206 * auVar708 + auVar205 * auVar707 + auVar208 * ZEXT816(0x1000003d10);
            uVar1147 = auVar175._0_8_;
            auVar1038._8_8_ = 0;
            auVar1038._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            uVar1149 = local_10d0 * 2;
            auVar209._8_8_ = 0;
            auVar209._0_8_ = local_10f0;
            auVar710._8_8_ = 0;
            auVar710._0_8_ = uVar1149;
            auVar210._8_8_ = 0;
            auVar210._0_8_ = local_10e8 * 2;
            auVar711._8_8_ = 0;
            auVar711._0_8_ = local_10d8;
            auVar211._8_8_ = 0;
            auVar211._0_8_ = local_10e0;
            auVar712._8_8_ = 0;
            auVar712._0_8_ = local_10e0;
            auVar212._8_8_ = 0;
            auVar212._0_8_ = uVar1132 >> 0x34 | SUB168(auVar207 * auVar709,8) << 0xc;
            auVar175 = auVar209 * auVar710 + auVar1038 + auVar210 * auVar711 + auVar211 * auVar712 +
                       auVar212 * ZEXT816(0x1000003d10);
            uVar1132 = auVar175._0_8_;
            auVar1039._8_8_ = 0;
            auVar1039._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar213._8_8_ = 0;
            auVar213._0_8_ = local_10f0;
            auVar713._8_8_ = 0;
            auVar713._0_8_ = local_10f0;
            auVar214._8_8_ = 0;
            auVar214._0_8_ = local_10e8;
            auVar714._8_8_ = 0;
            auVar714._0_8_ = uVar1149;
            auVar215._8_8_ = 0;
            auVar215._0_8_ = local_10e0 * 2;
            auVar715._8_8_ = 0;
            auVar715._0_8_ = local_10d8;
            auVar175 = auVar214 * auVar714 + auVar1039 + auVar215 * auVar715;
            uVar1148 = auVar175._0_8_;
            auVar1041._8_8_ = 0;
            auVar1041._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar716._8_8_ = 0;
            auVar716._0_8_ =
                 (uVar1148 & 0xfffffffffffff) << 4 | (uVar1132 & 0xfffffffffffff) >> 0x30;
            auVar175 = auVar213 * auVar713 + ZEXT816(0x1000003d1) * auVar716;
            uVar1148 = auVar175._0_8_;
            local_1140 = uVar1148 & 0xfffffffffffff;
            auVar1040._8_8_ = 0;
            auVar1040._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar216._8_8_ = 0;
            auVar216._0_8_ = local_10f0 * 2;
            auVar717._8_8_ = 0;
            auVar717._0_8_ = local_10e8;
            auVar217._8_8_ = 0;
            auVar217._0_8_ = local_10e0;
            auVar718._8_8_ = 0;
            auVar718._0_8_ = uVar1149;
            auVar218._8_8_ = 0;
            auVar218._0_8_ = local_10d8;
            auVar719._8_8_ = 0;
            auVar719._0_8_ = local_10d8;
            auVar1166 = auVar217 * auVar718 + auVar1041 + auVar218 * auVar719;
            uVar1148 = auVar1166._0_8_;
            auVar219._8_8_ = 0;
            auVar219._0_8_ = uVar1148 & 0xfffffffffffff;
            auVar175 = auVar216 * auVar717 + auVar1040 + auVar219 * ZEXT816(0x1000003d10);
            uVar1154 = auVar175._0_8_;
            auVar1043._8_8_ = 0;
            auVar1043._0_8_ = uVar1148 >> 0x34 | auVar1166._8_8_ << 0xc;
            local_1138 = uVar1154 & 0xfffffffffffff;
            auVar1042._8_8_ = 0;
            auVar1042._0_8_ = uVar1154 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar220._8_8_ = 0;
            auVar220._0_8_ = local_10f0 * 2;
            auVar720._8_8_ = 0;
            auVar720._0_8_ = local_10e0;
            auVar221._8_8_ = 0;
            auVar221._0_8_ = local_10e8;
            auVar721._8_8_ = 0;
            auVar721._0_8_ = local_10e8;
            auVar222._8_8_ = 0;
            auVar222._0_8_ = local_10d8;
            auVar722._8_8_ = 0;
            auVar722._0_8_ = uVar1149;
            auVar1043 = auVar222 * auVar722 + auVar1043;
            uVar1149 = auVar1043._0_8_;
            auVar223._8_8_ = 0;
            auVar223._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar220 * auVar720 + auVar1042 + auVar221 * auVar721 +
                       auVar223 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            local_1130 = uVar1148 & 0xfffffffffffff;
            auVar1044._8_8_ = 0;
            auVar1044._0_8_ =
                 (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1147 & 0xfffffffffffff);
            auVar224._8_8_ = 0;
            auVar224._0_8_ = uVar1149 >> 0x34 | auVar1043._8_8_ << 0xc;
            auVar1044 = auVar224 * ZEXT816(0x1000003d10) + auVar1044;
            uVar1149 = auVar1044._0_8_;
            local_1128 = uVar1149 & 0xfffffffffffff;
            local_1120 = (uVar1149 >> 0x34 | auVar1044._8_8_ << 0xc) + (uVar1132 & 0xffffffffffff);
            uVar1149 = (r->x).n[4];
            uVar1142 = (uVar1149 >> 0x30) * 0x1000003d1 + (r->x).n[0];
            uVar1152 = (uVar1142 >> 0x34) + (r->x).n[1];
            uVar1142 = uVar1142 & 0xfffffffffffff;
            uVar1139 = (uVar1152 >> 0x34) + (r->x).n[2];
            uVar1152 = uVar1152 & 0xfffffffffffff;
            uVar1143 = (uVar1139 >> 0x34) + (r->x).n[3];
            uVar1139 = uVar1139 & 0xfffffffffffff;
            uVar1140 = (uVar1143 >> 0x34) + (uVar1149 & 0xffffffffffff);
            uVar1143 = uVar1143 & 0xfffffffffffff;
            auVar225._8_8_ = 0;
            auVar225._0_8_ = local_1140;
            auVar723._8_8_ = 0;
            auVar723._0_8_ = local_1258.x.n[3];
            auVar226._8_8_ = 0;
            auVar226._0_8_ = local_1138;
            auVar724._8_8_ = 0;
            auVar724._0_8_ = local_1258.x.n[2];
            auVar227._8_8_ = 0;
            auVar227._0_8_ = local_1130;
            auVar725._8_8_ = 0;
            auVar725._0_8_ = local_1258.x.n[1];
            auVar228._8_8_ = 0;
            auVar228._0_8_ = local_1128;
            auVar726._8_8_ = 0;
            auVar726._0_8_ = local_1258.x.n[0];
            auVar229._8_8_ = 0;
            auVar229._0_8_ = local_1120;
            auVar727._8_8_ = 0;
            auVar727._0_8_ = local_1258.x.n[4];
            uVar1149 = SUB168(auVar229 * auVar727,0);
            auVar230._8_8_ = 0;
            auVar230._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar226 * auVar724 + auVar225 * auVar723 + auVar227 * auVar725 +
                       auVar228 * auVar726 + auVar230 * ZEXT816(0x1000003d10);
            uVar1132 = auVar175._0_8_;
            auVar1045._8_8_ = 0;
            auVar1045._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar231._8_8_ = 0;
            auVar231._0_8_ = local_1140;
            auVar728._8_8_ = 0;
            auVar728._0_8_ = local_1258.x.n[4];
            auVar232._8_8_ = 0;
            auVar232._0_8_ = local_1138;
            auVar729._8_8_ = 0;
            auVar729._0_8_ = local_1258.x.n[3];
            auVar233._8_8_ = 0;
            auVar233._0_8_ = local_1130;
            auVar730._8_8_ = 0;
            auVar730._0_8_ = local_1258.x.n[2];
            auVar234._8_8_ = 0;
            auVar234._0_8_ = local_1128;
            auVar731._8_8_ = 0;
            auVar731._0_8_ = local_1258.x.n[1];
            auVar235._8_8_ = 0;
            auVar235._0_8_ = local_1120;
            auVar732._8_8_ = 0;
            auVar732._0_8_ = local_1258.x.n[0];
            auVar236._8_8_ = 0;
            auVar236._0_8_ = uVar1149 >> 0x34 | SUB168(auVar229 * auVar727,8) << 0xc;
            auVar175 = auVar231 * auVar728 + auVar1045 + auVar232 * auVar729 + auVar233 * auVar730 +
                       auVar234 * auVar731 + auVar235 * auVar732 + auVar236 * ZEXT816(0x1000003d10);
            uVar1149 = auVar175._0_8_;
            auVar1046._8_8_ = 0;
            auVar1046._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar237._8_8_ = 0;
            auVar237._0_8_ = local_1140;
            auVar733._8_8_ = 0;
            auVar733._0_8_ = local_1258.x.n[0];
            auVar238._8_8_ = 0;
            auVar238._0_8_ = local_1138;
            auVar734._8_8_ = 0;
            auVar734._0_8_ = local_1258.x.n[4];
            auVar239._8_8_ = 0;
            auVar239._0_8_ = local_1130;
            auVar735._8_8_ = 0;
            auVar735._0_8_ = local_1258.x.n[3];
            auVar240._8_8_ = 0;
            auVar240._0_8_ = local_1128;
            auVar736._8_8_ = 0;
            auVar736._0_8_ = local_1258.x.n[2];
            auVar241._8_8_ = 0;
            auVar241._0_8_ = local_1120;
            auVar737._8_8_ = 0;
            auVar737._0_8_ = local_1258.x.n[1];
            auVar175 = auVar238 * auVar734 + auVar1046 + auVar239 * auVar735 + auVar240 * auVar736 +
                       auVar241 * auVar737;
            uVar1147 = auVar175._0_8_;
            auVar1048._8_8_ = 0;
            auVar1048._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar738._8_8_ = 0;
            auVar738._0_8_ =
                 (uVar1147 & 0xfffffffffffff) << 4 | (uVar1149 & 0xfffffffffffff) >> 0x30;
            auVar175 = auVar237 * auVar733 + ZEXT816(0x1000003d1) * auVar738;
            uVar1147 = auVar175._0_8_;
            local_1280 = uVar1147 & 0xfffffffffffff;
            auVar1047._8_8_ = 0;
            auVar1047._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar242._8_8_ = 0;
            auVar242._0_8_ = local_1140;
            auVar739._8_8_ = 0;
            auVar739._0_8_ = local_1258.x.n[1];
            auVar243._8_8_ = 0;
            auVar243._0_8_ = local_1138;
            auVar740._8_8_ = 0;
            auVar740._0_8_ = local_1258.x.n[0];
            auVar244._8_8_ = 0;
            auVar244._0_8_ = local_1130;
            auVar741._8_8_ = 0;
            auVar741._0_8_ = local_1258.x.n[4];
            auVar245._8_8_ = 0;
            auVar245._0_8_ = local_1128;
            auVar742._8_8_ = 0;
            auVar742._0_8_ = local_1258.x.n[3];
            auVar246._8_8_ = 0;
            auVar246._0_8_ = local_1120;
            auVar743._8_8_ = 0;
            auVar743._0_8_ = local_1258.x.n[2];
            auVar1166 = auVar244 * auVar741 + auVar1048 + auVar245 * auVar742 + auVar246 * auVar743;
            uVar1147 = auVar1166._0_8_;
            auVar247._8_8_ = 0;
            auVar247._0_8_ = uVar1147 & 0xfffffffffffff;
            auVar175 = auVar242 * auVar739 + auVar1047 + auVar243 * auVar740 +
                       auVar247 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            auVar1050._8_8_ = 0;
            auVar1050._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
            local_1278 = uVar1148 & 0xfffffffffffff;
            auVar1049._8_8_ = 0;
            auVar1049._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar248._8_8_ = 0;
            auVar248._0_8_ = local_1140;
            auVar744._8_8_ = 0;
            auVar744._0_8_ = local_1258.x.n[2];
            auVar249._8_8_ = 0;
            auVar249._0_8_ = local_1138;
            auVar745._8_8_ = 0;
            auVar745._0_8_ = local_1258.x.n[1];
            auVar250._8_8_ = 0;
            auVar250._0_8_ = local_1130;
            auVar746._8_8_ = 0;
            auVar746._0_8_ = local_1258.x.n[0];
            auVar251._8_8_ = 0;
            auVar251._0_8_ = local_1128;
            auVar747._8_8_ = 0;
            auVar747._0_8_ = local_1258.x.n[4];
            auVar252._8_8_ = 0;
            auVar252._0_8_ = local_1120;
            auVar748._8_8_ = 0;
            auVar748._0_8_ = local_1258.x.n[3];
            auVar1166 = auVar251 * auVar747 + auVar1050 + auVar252 * auVar748;
            uVar1147 = auVar1166._0_8_;
            auVar253._8_8_ = 0;
            auVar253._0_8_ = uVar1147 & 0xfffffffffffff;
            auVar175 = auVar248 * auVar744 + auVar1049 + auVar249 * auVar745 + auVar250 * auVar746 +
                       auVar253 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            local_1270 = uVar1148 & 0xfffffffffffff;
            auVar1051._8_8_ = 0;
            auVar1051._0_8_ =
                 (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1132 & 0xfffffffffffff);
            auVar254._8_8_ = 0;
            auVar254._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
            auVar1051 = auVar254 * ZEXT816(0x1000003d10) + auVar1051;
            uVar1132 = auVar1051._0_8_;
            local_1268 = uVar1132 & 0xfffffffffffff;
            lStack_1260 = (uVar1132 >> 0x34 | auVar1051._8_8_ << 0xc) + (uVar1149 & 0xffffffffffff);
            uVar1149 = (r->y).n[4];
            uVar1162 = (uVar1149 >> 0x30) * 0x1000003d1 + psVar1->n[0];
            uVar1144 = (uVar1162 >> 0x34) + (r->y).n[1];
            uVar1162 = uVar1162 & 0xfffffffffffff;
            uVar1155 = (uVar1144 >> 0x34) + (r->y).n[2];
            uVar1144 = uVar1144 & 0xfffffffffffff;
            uVar1145 = (uVar1155 >> 0x34) + (r->y).n[3];
            uVar1155 = uVar1155 & 0xfffffffffffff;
            uVar1135 = (uVar1145 >> 0x34) + (uVar1149 & 0xffffffffffff);
            uVar1145 = uVar1145 & 0xfffffffffffff;
            auVar255._8_8_ = 0;
            auVar255._0_8_ = local_1140;
            auVar749._8_8_ = 0;
            auVar749._0_8_ = local_1258.y.n[3];
            auVar256._8_8_ = 0;
            auVar256._0_8_ = local_1138;
            auVar750._8_8_ = 0;
            auVar750._0_8_ = local_1258.y.n[2];
            auVar257._8_8_ = 0;
            auVar257._0_8_ = local_1130;
            auVar751._8_8_ = 0;
            auVar751._0_8_ = local_1258.y.n[1];
            auVar258._8_8_ = 0;
            auVar258._0_8_ = local_1128;
            auVar752._8_8_ = 0;
            auVar752._0_8_ = local_1258.y.n[0];
            auVar259._8_8_ = 0;
            auVar259._0_8_ = local_1120;
            auVar753._8_8_ = 0;
            auVar753._0_8_ = local_1258.y.n[4];
            uVar1149 = SUB168(auVar259 * auVar753,0);
            auVar260._8_8_ = 0;
            auVar260._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar256 * auVar750 + auVar255 * auVar749 + auVar257 * auVar751 +
                       auVar258 * auVar752 + auVar260 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            auVar1052._8_8_ = 0;
            auVar1052._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar261._8_8_ = 0;
            auVar261._0_8_ = local_1140;
            auVar754._8_8_ = 0;
            auVar754._0_8_ = local_1258.y.n[4];
            auVar262._8_8_ = 0;
            auVar262._0_8_ = local_1138;
            auVar755._8_8_ = 0;
            auVar755._0_8_ = local_1258.y.n[3];
            auVar263._8_8_ = 0;
            auVar263._0_8_ = local_1130;
            auVar756._8_8_ = 0;
            auVar756._0_8_ = local_1258.y.n[2];
            auVar264._8_8_ = 0;
            auVar264._0_8_ = local_1128;
            auVar757._8_8_ = 0;
            auVar757._0_8_ = local_1258.y.n[1];
            auVar265._8_8_ = 0;
            auVar265._0_8_ = local_1120;
            auVar758._8_8_ = 0;
            auVar758._0_8_ = local_1258.y.n[0];
            auVar266._8_8_ = 0;
            auVar266._0_8_ = uVar1149 >> 0x34 | SUB168(auVar259 * auVar753,8) << 0xc;
            auVar175 = auVar261 * auVar754 + auVar1052 + auVar262 * auVar755 + auVar263 * auVar756 +
                       auVar264 * auVar757 + auVar265 * auVar758 + auVar266 * ZEXT816(0x1000003d10);
            uVar1154 = auVar175._0_8_;
            auVar1053._8_8_ = 0;
            auVar1053._0_8_ = uVar1154 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar267._8_8_ = 0;
            auVar267._0_8_ = local_1140;
            auVar759._8_8_ = 0;
            auVar759._0_8_ = local_1258.y.n[0];
            auVar268._8_8_ = 0;
            auVar268._0_8_ = local_1138;
            auVar760._8_8_ = 0;
            auVar760._0_8_ = local_1258.y.n[4];
            auVar269._8_8_ = 0;
            auVar269._0_8_ = local_1130;
            auVar761._8_8_ = 0;
            auVar761._0_8_ = local_1258.y.n[3];
            auVar270._8_8_ = 0;
            auVar270._0_8_ = local_1128;
            auVar762._8_8_ = 0;
            auVar762._0_8_ = local_1258.y.n[2];
            auVar271._8_8_ = 0;
            auVar271._0_8_ = local_1120;
            auVar763._8_8_ = 0;
            auVar763._0_8_ = local_1258.y.n[1];
            auVar175 = auVar268 * auVar760 + auVar1053 + auVar269 * auVar761 + auVar270 * auVar762 +
                       auVar271 * auVar763;
            uVar1149 = auVar175._0_8_;
            auVar1055._8_8_ = 0;
            auVar1055._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar764._8_8_ = 0;
            auVar764._0_8_ =
                 (uVar1149 & 0xfffffffffffff) << 4 | (uVar1154 & 0xfffffffffffff) >> 0x30;
            auVar175 = auVar267 * auVar759 + ZEXT816(0x1000003d1) * auVar764;
            uVar1132 = auVar175._0_8_;
            uVar1149 = uVar1132 & 0xfffffffffffff;
            auVar1054._8_8_ = 0;
            auVar1054._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar272._8_8_ = 0;
            auVar272._0_8_ = local_1140;
            auVar765._8_8_ = 0;
            auVar765._0_8_ = local_1258.y.n[1];
            auVar273._8_8_ = 0;
            auVar273._0_8_ = local_1138;
            auVar766._8_8_ = 0;
            auVar766._0_8_ = local_1258.y.n[0];
            auVar274._8_8_ = 0;
            auVar274._0_8_ = local_1130;
            auVar767._8_8_ = 0;
            auVar767._0_8_ = local_1258.y.n[4];
            auVar275._8_8_ = 0;
            auVar275._0_8_ = local_1128;
            auVar768._8_8_ = 0;
            auVar768._0_8_ = local_1258.y.n[3];
            auVar276._8_8_ = 0;
            auVar276._0_8_ = local_1120;
            auVar769._8_8_ = 0;
            auVar769._0_8_ = local_1258.y.n[2];
            auVar1166 = auVar274 * auVar767 + auVar1055 + auVar275 * auVar768 + auVar276 * auVar769;
            uVar1132 = auVar1166._0_8_;
            auVar277._8_8_ = 0;
            auVar277._0_8_ = uVar1132 & 0xfffffffffffff;
            auVar175 = auVar272 * auVar765 + auVar1054 + auVar273 * auVar766 +
                       auVar277 * ZEXT816(0x1000003d10);
            uVar1147 = auVar175._0_8_;
            auVar1057._8_8_ = 0;
            auVar1057._0_8_ = uVar1132 >> 0x34 | auVar1166._8_8_ << 0xc;
            uVar1132 = uVar1147 & 0xfffffffffffff;
            auVar1056._8_8_ = 0;
            auVar1056._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar278._8_8_ = 0;
            auVar278._0_8_ = local_1140;
            auVar770._8_8_ = 0;
            auVar770._0_8_ = local_1258.y.n[2];
            auVar279._8_8_ = 0;
            auVar279._0_8_ = local_1138;
            auVar771._8_8_ = 0;
            auVar771._0_8_ = local_1258.y.n[1];
            auVar280._8_8_ = 0;
            auVar280._0_8_ = local_1130;
            auVar772._8_8_ = 0;
            auVar772._0_8_ = local_1258.y.n[0];
            auVar281._8_8_ = 0;
            auVar281._0_8_ = local_1128;
            auVar773._8_8_ = 0;
            auVar773._0_8_ = local_1258.y.n[4];
            auVar282._8_8_ = 0;
            auVar282._0_8_ = local_1120;
            auVar774._8_8_ = 0;
            auVar774._0_8_ = local_1258.y.n[3];
            auVar1166 = auVar281 * auVar773 + auVar1057 + auVar282 * auVar774;
            uVar1136 = auVar1166._0_8_;
            auVar283._8_8_ = 0;
            auVar283._0_8_ = uVar1136 & 0xfffffffffffff;
            auVar175 = auVar278 * auVar770 + auVar1056 + auVar279 * auVar771 + auVar280 * auVar772 +
                       auVar283 * ZEXT816(0x1000003d10);
            uVar1156 = auVar175._0_8_;
            uVar1147 = uVar1156 & 0xfffffffffffff;
            auVar1058._8_8_ = 0;
            auVar1058._0_8_ =
                 (uVar1156 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1148 & 0xfffffffffffff);
            auVar284._8_8_ = 0;
            auVar284._0_8_ = uVar1136 >> 0x34 | auVar1166._8_8_ << 0xc;
            auVar1058 = auVar284 * ZEXT816(0x1000003d10) + auVar1058;
            uVar1136 = auVar1058._0_8_;
            uVar1148 = uVar1136 & 0xfffffffffffff;
            uVar1157 = (uVar1136 >> 0x34 | auVar1058._8_8_ << 0xc) + (uVar1154 & 0xffffffffffff);
            auVar285._8_8_ = 0;
            auVar285._0_8_ = local_10f0;
            auVar775._8_8_ = 0;
            auVar775._0_8_ = uVar1148;
            auVar286._8_8_ = 0;
            auVar286._0_8_ = local_10e8;
            auVar776._8_8_ = 0;
            auVar776._0_8_ = uVar1147;
            auVar287._8_8_ = 0;
            auVar287._0_8_ = local_10e0;
            auVar777._8_8_ = 0;
            auVar777._0_8_ = uVar1132;
            auVar288._8_8_ = 0;
            auVar288._0_8_ = local_10d8;
            auVar778._8_8_ = 0;
            auVar778._0_8_ = uVar1149;
            auVar289._8_8_ = 0;
            auVar289._0_8_ = local_10d0;
            auVar779._8_8_ = 0;
            auVar779._0_8_ = uVar1157;
            uVar1154 = SUB168(auVar289 * auVar779,0);
            auVar290._8_8_ = 0;
            auVar290._0_8_ = uVar1154 & 0xfffffffffffff;
            auVar175 = auVar286 * auVar776 + auVar285 * auVar775 + auVar287 * auVar777 +
                       auVar288 * auVar778 + auVar290 * ZEXT816(0x1000003d10);
            uVar1136 = auVar175._0_8_;
            auVar1059._8_8_ = 0;
            auVar1059._0_8_ = uVar1136 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar291._8_8_ = 0;
            auVar291._0_8_ = local_10f0;
            auVar780._8_8_ = 0;
            auVar780._0_8_ = uVar1157;
            auVar292._8_8_ = 0;
            auVar292._0_8_ = local_10e8;
            auVar781._8_8_ = 0;
            auVar781._0_8_ = uVar1148;
            auVar293._8_8_ = 0;
            auVar293._0_8_ = local_10e0;
            auVar782._8_8_ = 0;
            auVar782._0_8_ = uVar1147;
            auVar294._8_8_ = 0;
            auVar294._0_8_ = local_10d8;
            auVar783._8_8_ = 0;
            auVar783._0_8_ = uVar1132;
            auVar295._8_8_ = 0;
            auVar295._0_8_ = local_10d0;
            auVar784._8_8_ = 0;
            auVar784._0_8_ = uVar1149;
            auVar296._8_8_ = 0;
            auVar296._0_8_ = uVar1154 >> 0x34 | SUB168(auVar289 * auVar779,8) << 0xc;
            auVar175 = auVar291 * auVar780 + auVar1059 + auVar292 * auVar781 + auVar293 * auVar782 +
                       auVar294 * auVar783 + auVar295 * auVar784 + auVar296 * ZEXT816(0x1000003d10);
            uVar1154 = auVar175._0_8_;
            auVar1060._8_8_ = 0;
            auVar1060._0_8_ = uVar1154 >> 0x34 | auVar175._8_8_ << 0xc;
            local_10c8 = (uVar1154 & 0xfffffffffffff) >> 0x30;
            auVar297._8_8_ = 0;
            auVar297._0_8_ = local_10f0;
            auVar785._8_8_ = 0;
            auVar785._0_8_ = uVar1149;
            auVar298._8_8_ = 0;
            auVar298._0_8_ = local_10e8;
            auVar786._8_8_ = 0;
            auVar786._0_8_ = uVar1157;
            auVar299._8_8_ = 0;
            auVar299._0_8_ = local_10e0;
            auVar787._8_8_ = 0;
            auVar787._0_8_ = uVar1148;
            auVar300._8_8_ = 0;
            auVar300._0_8_ = local_10d8;
            auVar788._8_8_ = 0;
            auVar788._0_8_ = uVar1147;
            auVar301._8_8_ = 0;
            auVar301._0_8_ = local_10d0;
            auVar789._8_8_ = 0;
            auVar789._0_8_ = uVar1132;
            auVar175 = auVar298 * auVar786 + auVar1060 + auVar299 * auVar787 + auVar300 * auVar788 +
                       auVar301 * auVar789;
            uVar1156 = auVar175._0_8_;
            auVar1062._8_8_ = 0;
            auVar1062._0_8_ = uVar1156 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar790._8_8_ = 0;
            auVar790._0_8_ = (uVar1156 & 0xfffffffffffff) << 4 | local_10c8;
            auVar175 = auVar297 * auVar785 + ZEXT816(0x1000003d1) * auVar790;
            uVar1156 = auVar175._0_8_;
            local_1098 = uVar1156 & 0xfffffffffffff;
            auVar1061._8_8_ = 0;
            auVar1061._0_8_ = uVar1156 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar302._8_8_ = 0;
            auVar302._0_8_ = local_10f0;
            auVar791._8_8_ = 0;
            auVar791._0_8_ = uVar1132;
            auVar303._8_8_ = 0;
            auVar303._0_8_ = local_10e8;
            auVar792._8_8_ = 0;
            auVar792._0_8_ = uVar1149;
            auVar304._8_8_ = 0;
            auVar304._0_8_ = local_10e0;
            auVar793._8_8_ = 0;
            auVar793._0_8_ = uVar1157;
            auVar305._8_8_ = 0;
            auVar305._0_8_ = local_10d8;
            auVar794._8_8_ = 0;
            auVar794._0_8_ = uVar1148;
            auVar306._8_8_ = 0;
            auVar306._0_8_ = local_10d0;
            auVar795._8_8_ = 0;
            auVar795._0_8_ = uVar1147;
            auVar1166 = auVar304 * auVar793 + auVar1062 + auVar305 * auVar794 + auVar306 * auVar795;
            uVar1156 = auVar1166._0_8_;
            auVar307._8_8_ = 0;
            auVar307._0_8_ = uVar1156 & 0xfffffffffffff;
            auVar175 = auVar302 * auVar791 + auVar1061 + auVar303 * auVar792 +
                       auVar307 * ZEXT816(0x1000003d10);
            uVar1158 = auVar175._0_8_;
            auVar1064._8_8_ = 0;
            auVar1064._0_8_ = uVar1156 >> 0x34 | auVar1166._8_8_ << 0xc;
            local_1090 = uVar1158 & 0xfffffffffffff;
            auVar1063._8_8_ = 0;
            auVar1063._0_8_ = uVar1158 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar308._8_8_ = 0;
            auVar308._0_8_ = local_10f0;
            auVar796._8_8_ = 0;
            auVar796._0_8_ = uVar1147;
            auVar309._8_8_ = 0;
            auVar309._0_8_ = local_10e8;
            auVar797._8_8_ = 0;
            auVar797._0_8_ = uVar1132;
            auVar310._8_8_ = 0;
            auVar310._0_8_ = local_10e0;
            auVar798._8_8_ = 0;
            auVar798._0_8_ = uVar1149;
            auVar311._8_8_ = 0;
            auVar311._0_8_ = local_10d8;
            auVar799._8_8_ = 0;
            auVar799._0_8_ = uVar1157;
            auVar312._8_8_ = 0;
            auVar312._0_8_ = local_10d0;
            auVar800._8_8_ = 0;
            auVar800._0_8_ = uVar1148;
            auVar1166 = auVar311 * auVar799 + auVar1064 + auVar312 * auVar800;
            uVar1149 = auVar1166._0_8_;
            auVar313._8_8_ = 0;
            auVar313._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar308 * auVar796 + auVar1063 + auVar309 * auVar797 + auVar310 * auVar798 +
                       auVar313 * ZEXT816(0x1000003d10);
            uVar1132 = auVar175._0_8_;
            local_1088 = uVar1132 & 0xfffffffffffff;
            auVar1065._8_8_ = 0;
            auVar1065._0_8_ =
                 (uVar1132 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1136 & 0xfffffffffffff);
            auVar314._8_8_ = 0;
            auVar314._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
            auVar1065 = auVar314 * ZEXT816(0x1000003d10) + auVar1065;
            uVar1149 = auVar1065._0_8_;
            local_1080 = uVar1149 & 0xfffffffffffff;
            lStack_1078 = (uVar1149 >> 0x34 | auVar1065._8_8_ << 0xc) + (uVar1154 & 0xffffffffffff);
            local_12a8.n[0] = (local_1280 - uVar1142) + 0x3ffffbfffff0bc;
            local_12a8.n[1] = (local_1278 - uVar1152) + 0x3ffffffffffffc;
            local_12a8.n[2] = (local_1270 - uVar1139) + 0x3ffffffffffffc;
            local_1118.n[0] = (local_1098 - uVar1162) + 0x3ffffbfffff0bc;
            local_1118.n[1] = (local_1090 - uVar1144) + 0x3ffffffffffffc;
            local_1118.n[2] = (local_1088 - uVar1155) + 0x3ffffffffffffc;
            local_12a8.n[3] = (local_1268 - uVar1143) + (long)DAT_0012c460;
            local_12a8.n[4] = (lStack_1260 - uVar1140) + DAT_0012c460._8_8_;
            local_1118.n[3] = (local_1080 - uVar1145) + (long)DAT_0012c460;
            local_1118.n[4] = (lStack_1078 - uVar1135) + DAT_0012c460._8_8_;
            local_11a0 = uVar1162;
            local_1198 = uVar1144;
            local_1190 = uVar1155;
            local_1188 = uVar1135;
            local_1180 = uVar1145;
            local_1178 = uVar1142;
            local_1170 = uVar1152;
            local_1168 = uVar1139;
            local_1160 = uVar1140;
            local_1158 = uVar1143;
            iVar1129 = secp256k1_fe_normalizes_to_zero_var(&local_12a8);
            if (iVar1129 == 0) {
              auVar315._8_8_ = 0;
              auVar315._0_8_ = local_1118.n[0] * 2;
              auVar801._8_8_ = 0;
              auVar801._0_8_ = local_1118.n[3];
              auVar316._8_8_ = 0;
              auVar316._0_8_ = local_1118.n[1] * 2;
              auVar802._8_8_ = 0;
              auVar802._0_8_ = local_1118.n[2];
              auVar317._8_8_ = 0;
              auVar317._0_8_ = local_1118.n[4];
              auVar803._8_8_ = 0;
              auVar803._0_8_ = local_1118.n[4];
              uVar1132 = SUB168(auVar317 * auVar803,0);
              auVar318._8_8_ = 0;
              auVar318._0_8_ = uVar1132 & 0xfffffffffffff;
              auVar175 = auVar316 * auVar802 + auVar315 * auVar801 +
                         auVar318 * ZEXT816(0x1000003d10);
              uVar1147 = auVar175._0_8_;
              auVar1066._8_8_ = 0;
              auVar1066._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
              uVar1149 = local_1118.n[4] * 2;
              auVar319._8_8_ = 0;
              auVar319._0_8_ = local_1118.n[0];
              auVar804._8_8_ = 0;
              auVar804._0_8_ = uVar1149;
              auVar320._8_8_ = 0;
              auVar320._0_8_ = local_1118.n[1] * 2;
              auVar805._8_8_ = 0;
              auVar805._0_8_ = local_1118.n[3];
              auVar321._8_8_ = 0;
              auVar321._0_8_ = local_1118.n[2];
              auVar806._8_8_ = 0;
              auVar806._0_8_ = local_1118.n[2];
              auVar322._8_8_ = 0;
              auVar322._0_8_ = uVar1132 >> 0x34 | SUB168(auVar317 * auVar803,8) << 0xc;
              auVar175 = auVar319 * auVar804 + auVar1066 + auVar320 * auVar805 + auVar321 * auVar806
                         + auVar322 * ZEXT816(0x1000003d10);
              uVar1132 = auVar175._0_8_;
              auVar1067._8_8_ = 0;
              auVar1067._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar323._8_8_ = 0;
              auVar323._0_8_ = local_1118.n[0];
              auVar807._8_8_ = 0;
              auVar807._0_8_ = local_1118.n[0];
              auVar324._8_8_ = 0;
              auVar324._0_8_ = local_1118.n[1];
              auVar808._8_8_ = 0;
              auVar808._0_8_ = uVar1149;
              auVar325._8_8_ = 0;
              auVar325._0_8_ = local_1118.n[2] * 2;
              auVar809._8_8_ = 0;
              auVar809._0_8_ = local_1118.n[3];
              auVar175 = auVar324 * auVar808 + auVar1067 + auVar325 * auVar809;
              uVar1148 = auVar175._0_8_;
              auVar1069._8_8_ = 0;
              auVar1069._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar810._8_8_ = 0;
              auVar810._0_8_ =
                   (uVar1148 & 0xfffffffffffff) << 4 | (uVar1132 & 0xfffffffffffff) >> 0x30;
              auVar175 = auVar323 * auVar807 + ZEXT816(0x1000003d1) * auVar810;
              uVar1148 = auVar175._0_8_;
              local_10c8 = uVar1148 & 0xfffffffffffff;
              auVar1068._8_8_ = 0;
              auVar1068._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar326._8_8_ = 0;
              auVar326._0_8_ = local_1118.n[0] * 2;
              auVar811._8_8_ = 0;
              auVar811._0_8_ = local_1118.n[1];
              auVar327._8_8_ = 0;
              auVar327._0_8_ = local_1118.n[2];
              auVar812._8_8_ = 0;
              auVar812._0_8_ = uVar1149;
              auVar328._8_8_ = 0;
              auVar328._0_8_ = local_1118.n[3];
              auVar813._8_8_ = 0;
              auVar813._0_8_ = local_1118.n[3];
              auVar1166 = auVar327 * auVar812 + auVar1069 + auVar328 * auVar813;
              uVar1148 = auVar1166._0_8_;
              auVar329._8_8_ = 0;
              auVar329._0_8_ = uVar1148 & 0xfffffffffffff;
              auVar175 = auVar326 * auVar811 + auVar1068 + auVar329 * ZEXT816(0x1000003d10);
              uVar1154 = auVar175._0_8_;
              auVar1071._8_8_ = 0;
              auVar1071._0_8_ = uVar1148 >> 0x34 | auVar1166._8_8_ << 0xc;
              uStack_10c0 = uVar1154 & 0xfffffffffffff;
              auVar1070._8_8_ = 0;
              auVar1070._0_8_ = uVar1154 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar330._8_8_ = 0;
              auVar330._0_8_ = local_1118.n[0] * 2;
              auVar814._8_8_ = 0;
              auVar814._0_8_ = local_1118.n[2];
              auVar331._8_8_ = 0;
              auVar331._0_8_ = local_1118.n[1];
              auVar815._8_8_ = 0;
              auVar815._0_8_ = local_1118.n[1];
              auVar332._8_8_ = 0;
              auVar332._0_8_ = local_1118.n[3];
              auVar816._8_8_ = 0;
              auVar816._0_8_ = uVar1149;
              auVar1071 = auVar332 * auVar816 + auVar1071;
              uVar1149 = auVar1071._0_8_;
              auVar333._8_8_ = 0;
              auVar333._0_8_ = uVar1149 & 0xfffffffffffff;
              auVar175 = auVar330 * auVar814 + auVar1070 + auVar331 * auVar815 +
                         auVar333 * ZEXT816(0x1000003d10);
              uVar1148 = auVar175._0_8_;
              local_10b8 = uVar1148 & 0xfffffffffffff;
              auVar1072._8_8_ = 0;
              auVar1072._0_8_ =
                   (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1147 & 0xfffffffffffff);
              auVar334._8_8_ = 0;
              auVar334._0_8_ = uVar1149 >> 0x34 | auVar1071._8_8_ << 0xc;
              auVar1072 = auVar334 * ZEXT816(0x1000003d10) + auVar1072;
              uVar1149 = auVar1072._0_8_;
              uStack_10b0 = uVar1149 & 0xfffffffffffff;
              local_10a8 = (uVar1149 >> 0x34 | auVar1072._8_8_ << 0xc) + (uVar1132 & 0xffffffffffff)
              ;
              auVar335._8_8_ = 0;
              auVar335._0_8_ = local_12a8.n[0] * 2;
              auVar817._8_8_ = 0;
              auVar817._0_8_ = local_12a8.n[3];
              auVar336._8_8_ = 0;
              auVar336._0_8_ = local_12a8.n[1] * 2;
              auVar818._8_8_ = 0;
              auVar818._0_8_ = local_12a8.n[2];
              auVar337._8_8_ = 0;
              auVar337._0_8_ = local_12a8.n[4];
              auVar819._8_8_ = 0;
              auVar819._0_8_ = local_12a8.n[4];
              uVar1132 = SUB168(auVar337 * auVar819,0);
              auVar338._8_8_ = 0;
              auVar338._0_8_ = uVar1132 & 0xfffffffffffff;
              auVar175 = auVar336 * auVar818 + auVar335 * auVar817 +
                         auVar338 * ZEXT816(0x1000003d10);
              uVar1147 = auVar175._0_8_;
              auVar1073._8_8_ = 0;
              auVar1073._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
              uVar1149 = local_12a8.n[4] * 2;
              auVar339._8_8_ = 0;
              auVar339._0_8_ = local_12a8.n[0];
              auVar820._8_8_ = 0;
              auVar820._0_8_ = uVar1149;
              auVar340._8_8_ = 0;
              auVar340._0_8_ = local_12a8.n[1] * 2;
              auVar821._8_8_ = 0;
              auVar821._0_8_ = local_12a8.n[3];
              auVar341._8_8_ = 0;
              auVar341._0_8_ = local_12a8.n[2];
              auVar822._8_8_ = 0;
              auVar822._0_8_ = local_12a8.n[2];
              auVar342._8_8_ = 0;
              auVar342._0_8_ = uVar1132 >> 0x34 | SUB168(auVar337 * auVar819,8) << 0xc;
              auVar175 = auVar339 * auVar820 + auVar1073 + auVar340 * auVar821 + auVar341 * auVar822
                         + auVar342 * ZEXT816(0x1000003d10);
              uVar1132 = auVar175._0_8_;
              auVar1074._8_8_ = 0;
              auVar1074._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar343._8_8_ = 0;
              auVar343._0_8_ = local_12a8.n[0];
              auVar823._8_8_ = 0;
              auVar823._0_8_ = local_12a8.n[0];
              auVar344._8_8_ = 0;
              auVar344._0_8_ = local_12a8.n[1];
              auVar824._8_8_ = 0;
              auVar824._0_8_ = uVar1149;
              auVar345._8_8_ = 0;
              auVar345._0_8_ = local_12a8.n[2] * 2;
              auVar825._8_8_ = 0;
              auVar825._0_8_ = local_12a8.n[3];
              auVar175 = auVar344 * auVar824 + auVar1074 + auVar345 * auVar825;
              uVar1148 = auVar175._0_8_;
              auVar1076._8_8_ = 0;
              auVar1076._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar826._8_8_ = 0;
              auVar826._0_8_ =
                   (uVar1148 & 0xfffffffffffff) << 4 | (uVar1132 & 0xfffffffffffff) >> 0x30;
              auVar175 = auVar343 * auVar823 + ZEXT816(0x1000003d1) * auVar826;
              uVar1148 = auVar175._0_8_;
              local_1070 = uVar1148 & 0xfffffffffffff;
              auVar1075._8_8_ = 0;
              auVar1075._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar346._8_8_ = 0;
              auVar346._0_8_ = local_12a8.n[0] * 2;
              auVar827._8_8_ = 0;
              auVar827._0_8_ = local_12a8.n[1];
              auVar347._8_8_ = 0;
              auVar347._0_8_ = local_12a8.n[2];
              auVar828._8_8_ = 0;
              auVar828._0_8_ = uVar1149;
              auVar348._8_8_ = 0;
              auVar348._0_8_ = local_12a8.n[3];
              auVar829._8_8_ = 0;
              auVar829._0_8_ = local_12a8.n[3];
              auVar1166 = auVar347 * auVar828 + auVar1076 + auVar348 * auVar829;
              uVar1148 = auVar1166._0_8_;
              auVar349._8_8_ = 0;
              auVar349._0_8_ = uVar1148 & 0xfffffffffffff;
              auVar175 = auVar346 * auVar827 + auVar1075 + auVar349 * ZEXT816(0x1000003d10);
              uVar1154 = auVar175._0_8_;
              auVar1078._8_8_ = 0;
              auVar1078._0_8_ = uVar1148 >> 0x34 | auVar1166._8_8_ << 0xc;
              local_1068 = uVar1154 & 0xfffffffffffff;
              auVar1077._8_8_ = 0;
              auVar1077._0_8_ = uVar1154 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar350._8_8_ = 0;
              auVar350._0_8_ = local_12a8.n[0] * 2;
              auVar830._8_8_ = 0;
              auVar830._0_8_ = local_12a8.n[2];
              auVar351._8_8_ = 0;
              auVar351._0_8_ = local_12a8.n[1];
              auVar831._8_8_ = 0;
              auVar831._0_8_ = local_12a8.n[1];
              auVar352._8_8_ = 0;
              auVar352._0_8_ = local_12a8.n[3];
              auVar832._8_8_ = 0;
              auVar832._0_8_ = uVar1149;
              auVar1078 = auVar352 * auVar832 + auVar1078;
              uVar1149 = auVar1078._0_8_;
              auVar353._8_8_ = 0;
              auVar353._0_8_ = uVar1149 & 0xfffffffffffff;
              auVar175 = auVar350 * auVar830 + auVar1077 + auVar351 * auVar831 +
                         auVar353 * ZEXT816(0x1000003d10);
              uVar1148 = auVar175._0_8_;
              local_1060 = uVar1148 & 0xfffffffffffff;
              auVar1079._8_8_ = 0;
              auVar1079._0_8_ =
                   (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1147 & 0xfffffffffffff);
              auVar354._8_8_ = 0;
              auVar354._0_8_ = uVar1149 >> 0x34 | auVar1078._8_8_ << 0xc;
              auVar1079 = auVar354 * ZEXT816(0x1000003d10) + auVar1079;
              uVar1149 = auVar1079._0_8_;
              local_1058 = uVar1149 & 0xfffffffffffff;
              local_1050 = (uVar1149 >> 0x34 | auVar1079._8_8_ << 0xc) + (uVar1132 & 0xffffffffffff)
              ;
              auVar355._8_8_ = 0;
              auVar355._0_8_ = local_1070;
              auVar833._8_8_ = 0;
              auVar833._0_8_ = local_12a8.n[3];
              auVar356._8_8_ = 0;
              auVar356._0_8_ = local_1068;
              auVar834._8_8_ = 0;
              auVar834._0_8_ = local_12a8.n[2];
              auVar357._8_8_ = 0;
              auVar357._0_8_ = local_1060;
              auVar835._8_8_ = 0;
              auVar835._0_8_ = local_12a8.n[1];
              auVar358._8_8_ = 0;
              auVar358._0_8_ = local_1058;
              auVar836._8_8_ = 0;
              auVar836._0_8_ = local_12a8.n[0];
              auVar359._8_8_ = 0;
              auVar359._0_8_ = local_1050;
              auVar837._8_8_ = 0;
              auVar837._0_8_ = local_12a8.n[4];
              uVar1149 = SUB168(auVar359 * auVar837,0);
              auVar360._8_8_ = 0;
              auVar360._0_8_ = uVar1149 & 0xfffffffffffff;
              auVar175 = auVar356 * auVar834 + auVar355 * auVar833 + auVar357 * auVar835 +
                         auVar358 * auVar836 + auVar360 * ZEXT816(0x1000003d10);
              uVar1132 = auVar175._0_8_;
              auVar1080._8_8_ = 0;
              auVar1080._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar361._8_8_ = 0;
              auVar361._0_8_ = local_1070;
              auVar838._8_8_ = 0;
              auVar838._0_8_ = local_12a8.n[4];
              auVar362._8_8_ = 0;
              auVar362._0_8_ = local_1068;
              auVar839._8_8_ = 0;
              auVar839._0_8_ = local_12a8.n[3];
              auVar363._8_8_ = 0;
              auVar363._0_8_ = local_1060;
              auVar840._8_8_ = 0;
              auVar840._0_8_ = local_12a8.n[2];
              auVar364._8_8_ = 0;
              auVar364._0_8_ = local_1058;
              auVar841._8_8_ = 0;
              auVar841._0_8_ = local_12a8.n[1];
              auVar365._8_8_ = 0;
              auVar365._0_8_ = local_1050;
              auVar842._8_8_ = 0;
              auVar842._0_8_ = local_12a8.n[0];
              auVar366._8_8_ = 0;
              auVar366._0_8_ = uVar1149 >> 0x34 | SUB168(auVar359 * auVar837,8) << 0xc;
              auVar175 = auVar361 * auVar838 + auVar1080 + auVar362 * auVar839 + auVar363 * auVar840
                         + auVar364 * auVar841 + auVar365 * auVar842 +
                         auVar366 * ZEXT816(0x1000003d10);
              uVar1149 = auVar175._0_8_;
              auVar1081._8_8_ = 0;
              auVar1081._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar367._8_8_ = 0;
              auVar367._0_8_ = local_1070;
              auVar843._8_8_ = 0;
              auVar843._0_8_ = local_12a8.n[0];
              auVar368._8_8_ = 0;
              auVar368._0_8_ = local_1068;
              auVar844._8_8_ = 0;
              auVar844._0_8_ = local_12a8.n[4];
              auVar369._8_8_ = 0;
              auVar369._0_8_ = local_1060;
              auVar845._8_8_ = 0;
              auVar845._0_8_ = local_12a8.n[3];
              auVar370._8_8_ = 0;
              auVar370._0_8_ = local_1058;
              auVar846._8_8_ = 0;
              auVar846._0_8_ = local_12a8.n[2];
              auVar371._8_8_ = 0;
              auVar371._0_8_ = local_1050;
              auVar847._8_8_ = 0;
              auVar847._0_8_ = local_12a8.n[1];
              auVar175 = auVar368 * auVar844 + auVar1081 + auVar369 * auVar845 + auVar370 * auVar846
                         + auVar371 * auVar847;
              uVar1147 = auVar175._0_8_;
              auVar1083._8_8_ = 0;
              auVar1083._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar848._8_8_ = 0;
              auVar848._0_8_ =
                   (uVar1147 & 0xfffffffffffff) << 4 | (uVar1149 & 0xfffffffffffff) >> 0x30;
              auVar175 = auVar367 * auVar843 + ZEXT816(0x1000003d1) * auVar848;
              uVar1147 = auVar175._0_8_;
              uVar1136 = uVar1147 & 0xfffffffffffff;
              auVar1082._8_8_ = 0;
              auVar1082._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar372._8_8_ = 0;
              auVar372._0_8_ = local_1070;
              auVar849._8_8_ = 0;
              auVar849._0_8_ = local_12a8.n[1];
              auVar373._8_8_ = 0;
              auVar373._0_8_ = local_1068;
              auVar850._8_8_ = 0;
              auVar850._0_8_ = local_12a8.n[0];
              auVar374._8_8_ = 0;
              auVar374._0_8_ = local_1060;
              auVar851._8_8_ = 0;
              auVar851._0_8_ = local_12a8.n[4];
              auVar375._8_8_ = 0;
              auVar375._0_8_ = local_1058;
              auVar852._8_8_ = 0;
              auVar852._0_8_ = local_12a8.n[3];
              auVar376._8_8_ = 0;
              auVar376._0_8_ = local_1050;
              auVar853._8_8_ = 0;
              auVar853._0_8_ = local_12a8.n[2];
              auVar1166 = auVar374 * auVar851 + auVar1083 + auVar375 * auVar852 +
                          auVar376 * auVar853;
              uVar1147 = auVar1166._0_8_;
              auVar377._8_8_ = 0;
              auVar377._0_8_ = uVar1147 & 0xfffffffffffff;
              auVar175 = auVar372 * auVar849 + auVar1082 + auVar373 * auVar850 +
                         auVar377 * ZEXT816(0x1000003d10);
              uVar1148 = auVar175._0_8_;
              auVar1085._8_8_ = 0;
              auVar1085._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
              uVar1156 = uVar1148 & 0xfffffffffffff;
              auVar1084._8_8_ = 0;
              auVar1084._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar378._8_8_ = 0;
              auVar378._0_8_ = local_1070;
              auVar854._8_8_ = 0;
              auVar854._0_8_ = local_12a8.n[2];
              auVar379._8_8_ = 0;
              auVar379._0_8_ = local_1068;
              auVar855._8_8_ = 0;
              auVar855._0_8_ = local_12a8.n[1];
              auVar380._8_8_ = 0;
              auVar380._0_8_ = local_1060;
              auVar856._8_8_ = 0;
              auVar856._0_8_ = local_12a8.n[0];
              auVar381._8_8_ = 0;
              auVar381._0_8_ = local_1058;
              auVar857._8_8_ = 0;
              auVar857._0_8_ = local_12a8.n[4];
              auVar382._8_8_ = 0;
              auVar382._0_8_ = local_1050;
              auVar858._8_8_ = 0;
              auVar858._0_8_ = local_12a8.n[3];
              auVar1166 = auVar381 * auVar857 + auVar1085 + auVar382 * auVar858;
              uVar1147 = auVar1166._0_8_;
              auVar383._8_8_ = 0;
              auVar383._0_8_ = uVar1147 & 0xfffffffffffff;
              auVar175 = auVar378 * auVar854 + auVar1084 + auVar379 * auVar855 + auVar380 * auVar856
                         + auVar383 * ZEXT816(0x1000003d10);
              uVar1148 = auVar175._0_8_;
              uVar1157 = uVar1148 & 0xfffffffffffff;
              auVar1086._8_8_ = 0;
              auVar1086._0_8_ =
                   (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1132 & 0xfffffffffffff);
              auVar384._8_8_ = 0;
              auVar384._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
              auVar1086 = auVar384 * ZEXT816(0x1000003d10) + auVar1086;
              uVar1132 = auVar1086._0_8_;
              uVar1158 = uVar1132 & 0xfffffffffffff;
              uVar1159 = (uVar1132 >> 0x34 | auVar1086._8_8_ << 0xc) + (uVar1149 & 0xffffffffffff);
              uVar1149 = psVar2->n[0];
              uVar1132 = (r->z).n[1];
              uVar1147 = (r->z).n[2];
              uVar1148 = (r->z).n[3];
              uVar1154 = (r->z).n[4];
              auVar385._8_8_ = 0;
              auVar385._0_8_ = local_12a8.n[0];
              auVar859._8_8_ = 0;
              auVar859._0_8_ = uVar1148;
              auVar386._8_8_ = 0;
              auVar386._0_8_ = local_12a8.n[1];
              auVar860._8_8_ = 0;
              auVar860._0_8_ = uVar1147;
              auVar387._8_8_ = 0;
              auVar387._0_8_ = local_12a8.n[2];
              auVar861._8_8_ = 0;
              auVar861._0_8_ = uVar1132;
              auVar388._8_8_ = 0;
              auVar388._0_8_ = local_12a8.n[3];
              auVar862._8_8_ = 0;
              auVar862._0_8_ = uVar1149;
              auVar389._8_8_ = 0;
              auVar389._0_8_ = local_12a8.n[4];
              auVar863._8_8_ = 0;
              auVar863._0_8_ = uVar1154;
              uVar1133 = SUB168(auVar389 * auVar863,0);
              auVar390._8_8_ = 0;
              auVar390._0_8_ = uVar1133 & 0xfffffffffffff;
              auVar175 = auVar386 * auVar860 + auVar385 * auVar859 + auVar387 * auVar861 +
                         auVar388 * auVar862 + auVar390 * ZEXT816(0x1000003d10);
              uVar1137 = auVar175._0_8_;
              auVar1087._8_8_ = 0;
              auVar1087._0_8_ = uVar1137 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar391._8_8_ = 0;
              auVar391._0_8_ = local_12a8.n[0];
              auVar864._8_8_ = 0;
              auVar864._0_8_ = uVar1154;
              auVar392._8_8_ = 0;
              auVar392._0_8_ = local_12a8.n[1];
              auVar865._8_8_ = 0;
              auVar865._0_8_ = uVar1148;
              auVar393._8_8_ = 0;
              auVar393._0_8_ = local_12a8.n[2];
              auVar866._8_8_ = 0;
              auVar866._0_8_ = uVar1147;
              auVar394._8_8_ = 0;
              auVar394._0_8_ = local_12a8.n[3];
              auVar867._8_8_ = 0;
              auVar867._0_8_ = uVar1132;
              auVar395._8_8_ = 0;
              auVar395._0_8_ = local_12a8.n[4];
              auVar868._8_8_ = 0;
              auVar868._0_8_ = uVar1149;
              auVar396._8_8_ = 0;
              auVar396._0_8_ = uVar1133 >> 0x34 | SUB168(auVar389 * auVar863,8) << 0xc;
              auVar175 = auVar391 * auVar864 + auVar1087 + auVar392 * auVar865 + auVar393 * auVar866
                         + auVar394 * auVar867 + auVar395 * auVar868 +
                         auVar396 * ZEXT816(0x1000003d10);
              uVar1133 = auVar175._0_8_;
              auVar1088._8_8_ = 0;
              auVar1088._0_8_ = uVar1133 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar397._8_8_ = 0;
              auVar397._0_8_ = local_12a8.n[0];
              auVar869._8_8_ = 0;
              auVar869._0_8_ = uVar1149;
              auVar398._8_8_ = 0;
              auVar398._0_8_ = local_12a8.n[1];
              auVar870._8_8_ = 0;
              auVar870._0_8_ = uVar1154;
              auVar399._8_8_ = 0;
              auVar399._0_8_ = local_12a8.n[2];
              auVar871._8_8_ = 0;
              auVar871._0_8_ = uVar1148;
              auVar400._8_8_ = 0;
              auVar400._0_8_ = local_12a8.n[3];
              auVar872._8_8_ = 0;
              auVar872._0_8_ = uVar1147;
              auVar401._8_8_ = 0;
              auVar401._0_8_ = local_12a8.n[4];
              auVar873._8_8_ = 0;
              auVar873._0_8_ = uVar1132;
              auVar175 = auVar398 * auVar870 + auVar1088 + auVar399 * auVar871 + auVar400 * auVar872
                         + auVar401 * auVar873;
              uVar1138 = auVar175._0_8_;
              auVar1090._8_8_ = 0;
              auVar1090._0_8_ = uVar1138 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar874._8_8_ = 0;
              auVar874._0_8_ =
                   (uVar1138 & 0xfffffffffffff) << 4 | (uVar1133 & 0xfffffffffffff) >> 0x30;
              auVar175 = auVar397 * auVar869 + ZEXT816(0x1000003d1) * auVar874;
              uVar1138 = auVar175._0_8_;
              psVar2->n[0] = uVar1138 & 0xfffffffffffff;
              auVar1089._8_8_ = 0;
              auVar1089._0_8_ = uVar1138 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar402._8_8_ = 0;
              auVar402._0_8_ = local_12a8.n[0];
              auVar875._8_8_ = 0;
              auVar875._0_8_ = uVar1132;
              auVar403._8_8_ = 0;
              auVar403._0_8_ = local_12a8.n[1];
              auVar876._8_8_ = 0;
              auVar876._0_8_ = uVar1149;
              auVar404._8_8_ = 0;
              auVar404._0_8_ = local_12a8.n[2];
              auVar877._8_8_ = 0;
              auVar877._0_8_ = uVar1154;
              auVar405._8_8_ = 0;
              auVar405._0_8_ = local_12a8.n[3];
              auVar878._8_8_ = 0;
              auVar878._0_8_ = uVar1148;
              auVar406._8_8_ = 0;
              auVar406._0_8_ = local_12a8.n[4];
              auVar879._8_8_ = 0;
              auVar879._0_8_ = uVar1147;
              auVar1166 = auVar404 * auVar877 + auVar1090 + auVar405 * auVar878 +
                          auVar406 * auVar879;
              uVar1138 = auVar1166._0_8_;
              auVar407._8_8_ = 0;
              auVar407._0_8_ = uVar1138 & 0xfffffffffffff;
              auVar175 = auVar402 * auVar875 + auVar1089 + auVar403 * auVar876 +
                         auVar407 * ZEXT816(0x1000003d10);
              uVar1160 = auVar175._0_8_;
              auVar1092._8_8_ = 0;
              auVar1092._0_8_ = uVar1138 >> 0x34 | auVar1166._8_8_ << 0xc;
              (r->z).n[1] = uVar1160 & 0xfffffffffffff;
              auVar1091._8_8_ = 0;
              auVar1091._0_8_ = uVar1160 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar408._8_8_ = 0;
              auVar408._0_8_ = local_12a8.n[0];
              auVar880._8_8_ = 0;
              auVar880._0_8_ = uVar1147;
              auVar409._8_8_ = 0;
              auVar409._0_8_ = local_12a8.n[1];
              auVar881._8_8_ = 0;
              auVar881._0_8_ = uVar1132;
              auVar410._8_8_ = 0;
              auVar410._0_8_ = local_12a8.n[2];
              auVar882._8_8_ = 0;
              auVar882._0_8_ = uVar1149;
              auVar411._8_8_ = 0;
              auVar411._0_8_ = local_12a8.n[3];
              auVar883._8_8_ = 0;
              auVar883._0_8_ = uVar1154;
              auVar412._8_8_ = 0;
              auVar412._0_8_ = local_12a8.n[4];
              auVar884._8_8_ = 0;
              auVar884._0_8_ = uVar1148;
              auVar1166 = auVar411 * auVar883 + auVar1092 + auVar412 * auVar884;
              uVar1149 = auVar1166._0_8_;
              auVar413._8_8_ = 0;
              auVar413._0_8_ = uVar1149 & 0xfffffffffffff;
              auVar175 = auVar408 * auVar880 + auVar1091 + auVar409 * auVar881 + auVar410 * auVar882
                         + auVar413 * ZEXT816(0x1000003d10);
              uVar1132 = auVar175._0_8_;
              (r->z).n[2] = uVar1132 & 0xfffffffffffff;
              auVar1093._8_8_ = 0;
              auVar1093._0_8_ =
                   (uVar1132 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1137 & 0xfffffffffffff);
              auVar414._8_8_ = 0;
              auVar414._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
              auVar1093 = auVar414 * ZEXT816(0x1000003d10) + auVar1093;
              uVar1149 = auVar1093._0_8_;
              (r->z).n[3] = uVar1149 & 0xfffffffffffff;
              (r->z).n[4] = (uVar1149 >> 0x34 | auVar1093._8_8_ << 0xc) +
                            (uVar1133 & 0xffffffffffff);
              auVar415._8_8_ = 0;
              auVar415._0_8_ = local_1070;
              auVar885._8_8_ = 0;
              auVar885._0_8_ = uVar1143;
              auVar416._8_8_ = 0;
              auVar416._0_8_ = local_1068;
              auVar886._8_8_ = 0;
              auVar886._0_8_ = uVar1139;
              auVar417._8_8_ = 0;
              auVar417._0_8_ = local_1060;
              auVar887._8_8_ = 0;
              auVar887._0_8_ = uVar1152;
              auVar418._8_8_ = 0;
              auVar418._0_8_ = local_1058;
              auVar888._8_8_ = 0;
              auVar888._0_8_ = uVar1142;
              auVar419._8_8_ = 0;
              auVar419._0_8_ = local_1050;
              auVar889._8_8_ = 0;
              auVar889._0_8_ = uVar1140;
              uVar1149 = SUB168(auVar419 * auVar889,0);
              auVar420._8_8_ = 0;
              auVar420._0_8_ = uVar1149 & 0xfffffffffffff;
              auVar175 = auVar416 * auVar886 + auVar415 * auVar885 + auVar417 * auVar887 +
                         auVar418 * auVar888 + auVar420 * ZEXT816(0x1000003d10);
              uVar1148 = auVar175._0_8_;
              auVar1094._8_8_ = 0;
              auVar1094._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar421._8_8_ = 0;
              auVar421._0_8_ = local_1070;
              auVar890._8_8_ = 0;
              auVar890._0_8_ = uVar1140;
              auVar422._8_8_ = 0;
              auVar422._0_8_ = local_1068;
              auVar891._8_8_ = 0;
              auVar891._0_8_ = uVar1143;
              auVar423._8_8_ = 0;
              auVar423._0_8_ = local_1060;
              auVar892._8_8_ = 0;
              auVar892._0_8_ = uVar1139;
              auVar424._8_8_ = 0;
              auVar424._0_8_ = local_1058;
              auVar893._8_8_ = 0;
              auVar893._0_8_ = uVar1152;
              auVar425._8_8_ = 0;
              auVar425._0_8_ = local_1050;
              auVar894._8_8_ = 0;
              auVar894._0_8_ = uVar1142;
              auVar426._8_8_ = 0;
              auVar426._0_8_ = uVar1149 >> 0x34 | SUB168(auVar419 * auVar889,8) << 0xc;
              auVar175 = auVar421 * auVar890 + auVar1094 + auVar422 * auVar891 + auVar423 * auVar892
                         + auVar424 * auVar893 + auVar425 * auVar894 +
                         auVar426 * ZEXT816(0x1000003d10);
              uVar1154 = auVar175._0_8_;
              auVar1095._8_8_ = 0;
              auVar1095._0_8_ = uVar1154 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar427._8_8_ = 0;
              auVar427._0_8_ = local_1070;
              auVar895._8_8_ = 0;
              auVar895._0_8_ = uVar1142;
              auVar428._8_8_ = 0;
              auVar428._0_8_ = local_1068;
              auVar896._8_8_ = 0;
              auVar896._0_8_ = uVar1140;
              auVar429._8_8_ = 0;
              auVar429._0_8_ = local_1060;
              auVar897._8_8_ = 0;
              auVar897._0_8_ = uVar1143;
              auVar430._8_8_ = 0;
              auVar430._0_8_ = local_1058;
              auVar898._8_8_ = 0;
              auVar898._0_8_ = uVar1139;
              auVar431._8_8_ = 0;
              auVar431._0_8_ = local_1050;
              auVar899._8_8_ = 0;
              auVar899._0_8_ = uVar1152;
              auVar175 = auVar428 * auVar896 + auVar1095 + auVar429 * auVar897 + auVar430 * auVar898
                         + auVar431 * auVar899;
              uVar1149 = auVar175._0_8_;
              auVar1097._8_8_ = 0;
              auVar1097._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar900._8_8_ = 0;
              auVar900._0_8_ =
                   (uVar1149 & 0xfffffffffffff) << 4 | (uVar1154 & 0xfffffffffffff) >> 0x30;
              auVar175 = auVar427 * auVar895 + ZEXT816(0x1000003d1) * auVar900;
              uVar1132 = auVar175._0_8_;
              uVar1149 = uVar1132 & 0xfffffffffffff;
              auVar1096._8_8_ = 0;
              auVar1096._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar432._8_8_ = 0;
              auVar432._0_8_ = local_1070;
              auVar901._8_8_ = 0;
              auVar901._0_8_ = uVar1152;
              auVar433._8_8_ = 0;
              auVar433._0_8_ = local_1068;
              auVar902._8_8_ = 0;
              auVar902._0_8_ = uVar1142;
              auVar434._8_8_ = 0;
              auVar434._0_8_ = local_1060;
              auVar903._8_8_ = 0;
              auVar903._0_8_ = uVar1140;
              auVar435._8_8_ = 0;
              auVar435._0_8_ = local_1058;
              auVar904._8_8_ = 0;
              auVar904._0_8_ = uVar1143;
              auVar436._8_8_ = 0;
              auVar436._0_8_ = local_1050;
              auVar905._8_8_ = 0;
              auVar905._0_8_ = uVar1139;
              auVar1166 = auVar434 * auVar903 + auVar1097 + auVar435 * auVar904 +
                          auVar436 * auVar905;
              uVar1132 = auVar1166._0_8_;
              auVar437._8_8_ = 0;
              auVar437._0_8_ = uVar1132 & 0xfffffffffffff;
              auVar175 = auVar432 * auVar901 + auVar1096 + auVar433 * auVar902 +
                         auVar437 * ZEXT816(0x1000003d10);
              uVar1147 = auVar175._0_8_;
              auVar1099._8_8_ = 0;
              auVar1099._0_8_ = uVar1132 >> 0x34 | auVar1166._8_8_ << 0xc;
              uVar1132 = uVar1147 & 0xfffffffffffff;
              auVar1098._8_8_ = 0;
              auVar1098._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar438._8_8_ = 0;
              auVar438._0_8_ = local_1070;
              auVar906._8_8_ = 0;
              auVar906._0_8_ = uVar1139;
              auVar439._8_8_ = 0;
              auVar439._0_8_ = local_1068;
              auVar907._8_8_ = 0;
              auVar907._0_8_ = uVar1152;
              auVar440._8_8_ = 0;
              auVar440._0_8_ = local_1060;
              auVar908._8_8_ = 0;
              auVar908._0_8_ = uVar1142;
              auVar441._8_8_ = 0;
              auVar441._0_8_ = local_1058;
              auVar909._8_8_ = 0;
              auVar909._0_8_ = uVar1140;
              auVar442._8_8_ = 0;
              auVar442._0_8_ = local_1050;
              auVar910._8_8_ = 0;
              auVar910._0_8_ = uVar1143;
              auVar1166 = auVar441 * auVar909 + auVar1099 + auVar442 * auVar910;
              uVar1139 = auVar1166._0_8_;
              auVar443._8_8_ = 0;
              auVar443._0_8_ = uVar1139 & 0xfffffffffffff;
              auVar175 = auVar438 * auVar906 + auVar1098 + auVar439 * auVar907 + auVar440 * auVar908
                         + auVar443 * ZEXT816(0x1000003d10);
              uVar1140 = auVar175._0_8_;
              uVar1147 = uVar1140 & 0xfffffffffffff;
              auVar1100._8_8_ = 0;
              auVar1100._0_8_ =
                   (uVar1140 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1148 & 0xfffffffffffff);
              auVar444._8_8_ = 0;
              auVar444._0_8_ = uVar1139 >> 0x34 | auVar1166._8_8_ << 0xc;
              auVar1100 = auVar444 * ZEXT816(0x1000003d10) + auVar1100;
              uVar1139 = auVar1100._0_8_;
              uVar1148 = uVar1139 & 0xfffffffffffff;
              uVar1161 = (uVar1139 >> 0x34 | auVar1100._8_8_ << 0xc) + (uVar1154 & 0xffffffffffff);
              (r->x).n[0] = uVar1149;
              (r->x).n[1] = uVar1132;
              (r->x).n[4] = uVar1161;
              (r->x).n[2] = uVar1147;
              (r->x).n[3] = uVar1148;
              lVar1165 = local_10c8 - ((r->x).n[0] * 2 + uVar1136);
              lVar1168 = uStack_10c0 - ((r->x).n[1] * 2 + uVar1156);
              (r->x).n[0] = lVar1165 + 0x7ffff7ffffe178;
              (r->x).n[1] = lVar1168 + 0x7ffffffffffff8;
              lVar1169 = local_10b8 - ((r->x).n[2] * 2 + uVar1157);
              lVar1170 = uStack_10b0 - ((r->x).n[3] * 2 + uVar1158);
              (r->x).n[2] = lVar1169 + 0x7ffffffffffff8;
              (r->x).n[3] = lVar1170 + 0x7ffffffffffff8;
              lVar1134 = local_10a8 - (uVar1161 * 2 + uVar1159);
              (r->x).n[4] = lVar1134 + 0x7fffffffffff8;
              (r->y).n[0] = (uVar1149 - lVar1165) + 0x3ffffbfffff0bc;
              (r->y).n[1] = (uVar1132 - lVar1168) + 0x3ffffffffffffc;
              (r->y).n[2] = (uVar1147 - lVar1169) + 0x3ffffffffffffc;
              (r->y).n[3] = (uVar1148 - lVar1170) + 0x3ffffffffffffc;
              (r->y).n[4] = (uVar1161 - lVar1134) + 0x3fffffffffffc;
              uVar1149 = psVar1->n[0];
              uVar1132 = (r->y).n[1];
              uVar1147 = (r->y).n[2];
              uVar1148 = (r->y).n[3];
              uVar1154 = (r->y).n[4];
              auVar445._8_8_ = 0;
              auVar445._0_8_ = local_1118.n[0];
              auVar911._8_8_ = 0;
              auVar911._0_8_ = uVar1148;
              auVar446._8_8_ = 0;
              auVar446._0_8_ = local_1118.n[1];
              auVar912._8_8_ = 0;
              auVar912._0_8_ = uVar1147;
              auVar447._8_8_ = 0;
              auVar447._0_8_ = local_1118.n[2];
              auVar913._8_8_ = 0;
              auVar913._0_8_ = uVar1132;
              auVar448._8_8_ = 0;
              auVar448._0_8_ = local_1118.n[3];
              auVar914._8_8_ = 0;
              auVar914._0_8_ = uVar1149;
              auVar449._8_8_ = 0;
              auVar449._0_8_ = local_1118.n[4];
              auVar915._8_8_ = 0;
              auVar915._0_8_ = uVar1154;
              uVar1139 = SUB168(auVar449 * auVar915,0);
              auVar450._8_8_ = 0;
              auVar450._0_8_ = uVar1139 & 0xfffffffffffff;
              auVar175 = auVar446 * auVar912 + auVar445 * auVar911 + auVar447 * auVar913 +
                         auVar448 * auVar914 + auVar450 * ZEXT816(0x1000003d10);
              uVar1140 = auVar175._0_8_;
              auVar1101._8_8_ = 0;
              auVar1101._0_8_ = uVar1140 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar451._8_8_ = 0;
              auVar451._0_8_ = local_1118.n[0];
              auVar916._8_8_ = 0;
              auVar916._0_8_ = uVar1154;
              auVar452._8_8_ = 0;
              auVar452._0_8_ = local_1118.n[1];
              auVar917._8_8_ = 0;
              auVar917._0_8_ = uVar1148;
              auVar453._8_8_ = 0;
              auVar453._0_8_ = local_1118.n[2];
              auVar918._8_8_ = 0;
              auVar918._0_8_ = uVar1147;
              auVar454._8_8_ = 0;
              auVar454._0_8_ = local_1118.n[3];
              auVar919._8_8_ = 0;
              auVar919._0_8_ = uVar1132;
              auVar455._8_8_ = 0;
              auVar455._0_8_ = local_1118.n[4];
              auVar920._8_8_ = 0;
              auVar920._0_8_ = uVar1149;
              auVar456._8_8_ = 0;
              auVar456._0_8_ = uVar1139 >> 0x34 | SUB168(auVar449 * auVar915,8) << 0xc;
              auVar175 = auVar451 * auVar916 + auVar1101 + auVar452 * auVar917 + auVar453 * auVar918
                         + auVar454 * auVar919 + auVar455 * auVar920 +
                         auVar456 * ZEXT816(0x1000003d10);
              uVar1139 = auVar175._0_8_;
              auVar1102._8_8_ = 0;
              auVar1102._0_8_ = uVar1139 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar457._8_8_ = 0;
              auVar457._0_8_ = local_1118.n[0];
              auVar921._8_8_ = 0;
              auVar921._0_8_ = uVar1149;
              auVar458._8_8_ = 0;
              auVar458._0_8_ = local_1118.n[1];
              auVar922._8_8_ = 0;
              auVar922._0_8_ = uVar1154;
              auVar459._8_8_ = 0;
              auVar459._0_8_ = local_1118.n[2];
              auVar923._8_8_ = 0;
              auVar923._0_8_ = uVar1148;
              auVar460._8_8_ = 0;
              auVar460._0_8_ = local_1118.n[3];
              auVar924._8_8_ = 0;
              auVar924._0_8_ = uVar1147;
              auVar461._8_8_ = 0;
              auVar461._0_8_ = local_1118.n[4];
              auVar925._8_8_ = 0;
              auVar925._0_8_ = uVar1132;
              auVar175 = auVar458 * auVar922 + auVar1102 + auVar459 * auVar923 + auVar460 * auVar924
                         + auVar461 * auVar925;
              uVar1142 = auVar175._0_8_;
              auVar1104._8_8_ = 0;
              auVar1104._0_8_ = uVar1142 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar926._8_8_ = 0;
              auVar926._0_8_ =
                   (uVar1142 & 0xfffffffffffff) << 4 | (uVar1139 & 0xfffffffffffff) >> 0x30;
              auVar175 = auVar457 * auVar921 + ZEXT816(0x1000003d1) * auVar926;
              uVar1142 = auVar175._0_8_;
              psVar1->n[0] = uVar1142 & 0xfffffffffffff;
              auVar1103._8_8_ = 0;
              auVar1103._0_8_ = uVar1142 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar462._8_8_ = 0;
              auVar462._0_8_ = local_1118.n[0];
              auVar927._8_8_ = 0;
              auVar927._0_8_ = uVar1132;
              auVar463._8_8_ = 0;
              auVar463._0_8_ = local_1118.n[1];
              auVar928._8_8_ = 0;
              auVar928._0_8_ = uVar1149;
              auVar464._8_8_ = 0;
              auVar464._0_8_ = local_1118.n[2];
              auVar929._8_8_ = 0;
              auVar929._0_8_ = uVar1154;
              auVar465._8_8_ = 0;
              auVar465._0_8_ = local_1118.n[3];
              auVar930._8_8_ = 0;
              auVar930._0_8_ = uVar1148;
              auVar466._8_8_ = 0;
              auVar466._0_8_ = local_1118.n[4];
              auVar931._8_8_ = 0;
              auVar931._0_8_ = uVar1147;
              auVar1166 = auVar464 * auVar929 + auVar1104 + auVar465 * auVar930 +
                          auVar466 * auVar931;
              uVar1142 = auVar1166._0_8_;
              auVar467._8_8_ = 0;
              auVar467._0_8_ = uVar1142 & 0xfffffffffffff;
              auVar175 = auVar462 * auVar927 + auVar1103 + auVar463 * auVar928 +
                         auVar467 * ZEXT816(0x1000003d10);
              uVar1143 = auVar175._0_8_;
              auVar1106._8_8_ = 0;
              auVar1106._0_8_ = uVar1142 >> 0x34 | auVar1166._8_8_ << 0xc;
              (r->y).n[1] = uVar1143 & 0xfffffffffffff;
              auVar1105._8_8_ = 0;
              auVar1105._0_8_ = uVar1143 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar468._8_8_ = 0;
              auVar468._0_8_ = local_1118.n[0];
              auVar932._8_8_ = 0;
              auVar932._0_8_ = uVar1147;
              auVar469._8_8_ = 0;
              auVar469._0_8_ = local_1118.n[1];
              auVar933._8_8_ = 0;
              auVar933._0_8_ = uVar1132;
              auVar470._8_8_ = 0;
              auVar470._0_8_ = local_1118.n[2];
              auVar934._8_8_ = 0;
              auVar934._0_8_ = uVar1149;
              auVar471._8_8_ = 0;
              auVar471._0_8_ = local_1118.n[3];
              auVar935._8_8_ = 0;
              auVar935._0_8_ = uVar1154;
              auVar472._8_8_ = 0;
              auVar472._0_8_ = local_1118.n[4];
              auVar936._8_8_ = 0;
              auVar936._0_8_ = uVar1148;
              auVar1166 = auVar471 * auVar935 + auVar1106 + auVar472 * auVar936;
              uVar1149 = auVar1166._0_8_;
              auVar473._8_8_ = 0;
              auVar473._0_8_ = uVar1149 & 0xfffffffffffff;
              auVar175 = auVar468 * auVar932 + auVar1105 + auVar469 * auVar933 + auVar470 * auVar934
                         + auVar473 * ZEXT816(0x1000003d10);
              uVar1132 = auVar175._0_8_;
              (r->y).n[2] = uVar1132 & 0xfffffffffffff;
              auVar1107._8_8_ = 0;
              auVar1107._0_8_ =
                   (uVar1132 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1140 & 0xfffffffffffff);
              auVar474._8_8_ = 0;
              auVar474._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
              auVar1107 = auVar474 * ZEXT816(0x1000003d10) + auVar1107;
              uVar1149 = auVar1107._0_8_;
              (r->y).n[3] = uVar1149 & 0xfffffffffffff;
              (r->y).n[4] = (uVar1149 >> 0x34 | auVar1107._8_8_ << 0xc) +
                            (uVar1139 & 0xffffffffffff);
              auVar475._8_8_ = 0;
              auVar475._0_8_ = uVar1162;
              auVar937._8_8_ = 0;
              auVar937._0_8_ = uVar1158;
              auVar476._8_8_ = 0;
              auVar476._0_8_ = uVar1144;
              auVar938._8_8_ = 0;
              auVar938._0_8_ = uVar1157;
              auVar477._8_8_ = 0;
              auVar477._0_8_ = uVar1155;
              auVar939._8_8_ = 0;
              auVar939._0_8_ = uVar1156;
              auVar478._8_8_ = 0;
              auVar478._0_8_ = uVar1145;
              auVar940._8_8_ = 0;
              auVar940._0_8_ = uVar1136;
              auVar479._8_8_ = 0;
              auVar479._0_8_ = uVar1135;
              auVar941._8_8_ = 0;
              auVar941._0_8_ = uVar1159;
              uVar1149 = SUB168(auVar479 * auVar941,0);
              auVar480._8_8_ = 0;
              auVar480._0_8_ = uVar1149 & 0xfffffffffffff;
              auVar175 = auVar476 * auVar938 + auVar475 * auVar937 + auVar477 * auVar939 +
                         auVar478 * auVar940 + auVar480 * ZEXT816(0x1000003d10);
              uVar1132 = auVar175._0_8_;
              auVar1108._8_8_ = 0;
              auVar1108._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar481._8_8_ = 0;
              auVar481._0_8_ = uVar1162;
              auVar942._8_8_ = 0;
              auVar942._0_8_ = uVar1159;
              auVar482._8_8_ = 0;
              auVar482._0_8_ = uVar1144;
              auVar943._8_8_ = 0;
              auVar943._0_8_ = uVar1158;
              auVar483._8_8_ = 0;
              auVar483._0_8_ = uVar1155;
              auVar944._8_8_ = 0;
              auVar944._0_8_ = uVar1157;
              auVar484._8_8_ = 0;
              auVar484._0_8_ = uVar1145;
              auVar945._8_8_ = 0;
              auVar945._0_8_ = uVar1156;
              auVar485._8_8_ = 0;
              auVar485._0_8_ = uVar1135;
              auVar946._8_8_ = 0;
              auVar946._0_8_ = uVar1136;
              auVar486._8_8_ = 0;
              auVar486._0_8_ = uVar1149 >> 0x34 | SUB168(auVar479 * auVar941,8) << 0xc;
              auVar175 = auVar481 * auVar942 + auVar1108 + auVar482 * auVar943 + auVar483 * auVar944
                         + auVar484 * auVar945 + auVar485 * auVar946 +
                         auVar486 * ZEXT816(0x1000003d10);
              uVar1149 = auVar175._0_8_;
              auVar1109._8_8_ = 0;
              auVar1109._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar487._8_8_ = 0;
              auVar487._0_8_ = uVar1162;
              auVar947._8_8_ = 0;
              auVar947._0_8_ = uVar1136;
              auVar488._8_8_ = 0;
              auVar488._0_8_ = uVar1144;
              auVar948._8_8_ = 0;
              auVar948._0_8_ = uVar1159;
              auVar489._8_8_ = 0;
              auVar489._0_8_ = uVar1155;
              auVar949._8_8_ = 0;
              auVar949._0_8_ = uVar1158;
              auVar490._8_8_ = 0;
              auVar490._0_8_ = uVar1145;
              auVar950._8_8_ = 0;
              auVar950._0_8_ = uVar1157;
              auVar491._8_8_ = 0;
              auVar491._0_8_ = uVar1135;
              auVar951._8_8_ = 0;
              auVar951._0_8_ = uVar1156;
              auVar175 = auVar488 * auVar948 + auVar1109 + auVar489 * auVar949 + auVar490 * auVar950
                         + auVar491 * auVar951;
              uVar1147 = auVar175._0_8_;
              auVar1111._8_8_ = 0;
              auVar1111._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar952._8_8_ = 0;
              auVar952._0_8_ =
                   (uVar1147 & 0xfffffffffffff) << 4 | (uVar1149 & 0xfffffffffffff) >> 0x30;
              auVar175 = auVar487 * auVar947 + ZEXT816(0x1000003d1) * auVar952;
              uVar1147 = auVar175._0_8_;
              local_11c8 = uVar1147 & 0xfffffffffffff;
              auVar1110._8_8_ = 0;
              auVar1110._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar492._8_8_ = 0;
              auVar492._0_8_ = uVar1162;
              auVar953._8_8_ = 0;
              auVar953._0_8_ = uVar1156;
              auVar493._8_8_ = 0;
              auVar493._0_8_ = uVar1144;
              auVar954._8_8_ = 0;
              auVar954._0_8_ = uVar1136;
              auVar494._8_8_ = 0;
              auVar494._0_8_ = uVar1155;
              auVar955._8_8_ = 0;
              auVar955._0_8_ = uVar1159;
              auVar495._8_8_ = 0;
              auVar495._0_8_ = uVar1145;
              auVar956._8_8_ = 0;
              auVar956._0_8_ = uVar1158;
              auVar496._8_8_ = 0;
              auVar496._0_8_ = uVar1135;
              auVar957._8_8_ = 0;
              auVar957._0_8_ = uVar1157;
              auVar1166 = auVar494 * auVar955 + auVar1111 + auVar495 * auVar956 +
                          auVar496 * auVar957;
              uVar1147 = auVar1166._0_8_;
              auVar497._8_8_ = 0;
              auVar497._0_8_ = uVar1147 & 0xfffffffffffff;
              auVar175 = auVar492 * auVar953 + auVar1110 + auVar493 * auVar954 +
                         auVar497 * ZEXT816(0x1000003d10);
              uVar1148 = auVar175._0_8_;
              auVar1113._8_8_ = 0;
              auVar1113._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
              uStack_11c0 = uVar1148 & 0xfffffffffffff;
              auVar1112._8_8_ = 0;
              auVar1112._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
              auVar498._8_8_ = 0;
              auVar498._0_8_ = uVar1162;
              auVar958._8_8_ = 0;
              auVar958._0_8_ = uVar1157;
              auVar499._8_8_ = 0;
              auVar499._0_8_ = uVar1144;
              auVar959._8_8_ = 0;
              auVar959._0_8_ = uVar1156;
              auVar500._8_8_ = 0;
              auVar500._0_8_ = uVar1155;
              auVar960._8_8_ = 0;
              auVar960._0_8_ = uVar1136;
              auVar501._8_8_ = 0;
              auVar501._0_8_ = uVar1145;
              auVar961._8_8_ = 0;
              auVar961._0_8_ = uVar1159;
              auVar502._8_8_ = 0;
              auVar502._0_8_ = uVar1135;
              auVar962._8_8_ = 0;
              auVar962._0_8_ = uVar1158;
              auVar1166 = auVar501 * auVar961 + auVar1113 + auVar502 * auVar962;
              uVar1147 = auVar1166._0_8_;
              auVar503._8_8_ = 0;
              auVar503._0_8_ = uVar1147 & 0xfffffffffffff;
              auVar175 = auVar498 * auVar958 + auVar1112 + auVar499 * auVar959 + auVar500 * auVar960
                         + auVar503 * ZEXT816(0x1000003d10);
              uVar1148 = auVar175._0_8_;
              local_11b8 = uVar1148 & 0xfffffffffffff;
              auVar1114._8_8_ = 0;
              auVar1114._0_8_ =
                   (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1132 & 0xfffffffffffff);
              auVar504._8_8_ = 0;
              auVar504._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
              auVar1114 = auVar504 * ZEXT816(0x1000003d10) + auVar1114;
              uVar1132 = auVar1114._0_8_;
              uStack_11b0 = uVar1132 & 0xfffffffffffff;
              local_11a8 = (uVar1132 >> 0x34 | auVar1114._8_8_ << 0xc) + (uVar1149 & 0xffffffffffff)
              ;
              uVar1123 = (r->y).n[1];
              uVar1124 = (r->y).n[2];
              uVar1125 = (r->y).n[3];
              uVar1161 = (r->y).n[4];
              (r->y).n[0] = ((r->y).n[0] - local_11c8) + 0x3ffffbfffff0bc;
              (r->y).n[1] = (uVar1123 - uStack_11c0) + 0x3ffffffffffffc;
              auVar1167._0_8_ = (uVar1124 - local_11b8) + 0x3ffffffffffffc;
              auVar1167._8_8_ = (uVar1125 - uStack_11b0) + 0x3ffffffffffffc;
              *(undefined1 (*) [16])((r->y).n + 2) = auVar1167;
              (r->y).n[4] = (uVar1161 - local_11a8) + 0x3fffffffffffc;
            }
            else {
              iVar1129 = secp256k1_fe_normalizes_to_zero_var(&local_1118);
              if (iVar1129 == 0) {
                r->infinity = 1;
                (r->x).n[0] = 0;
                (r->x).n[1] = 0;
                (r->x).n[2] = 0;
                (r->x).n[3] = 0;
                *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
                (r->y).n[1] = 0;
                (r->y).n[2] = 0;
                (r->y).n[3] = 0;
                (r->y).n[4] = 0;
                (r->z).n[0] = 0;
                (r->z).n[1] = 0;
                (r->z).n[2] = 0;
                (r->z).n[3] = 0;
                (r->z).n[4] = 0;
              }
              else {
                secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
              }
            }
          }
          else {
            r->infinity = 0;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = local_11f8 * 2;
            auVar587._8_8_ = 0;
            auVar587._0_8_ = local_11e0._0_8_;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = auStack_11f0._0_8_ * 2;
            auVar588._8_8_ = 0;
            auVar588._0_8_ = auStack_11f0._8_8_;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = local_11e0._8_8_;
            auVar589._8_8_ = 0;
            auVar589._0_8_ = local_11e0._8_8_;
            uVar1132 = SUB168(auVar67 * auVar589,0);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = uVar1132 & 0xfffffffffffff;
            auVar175 = auVar66 * auVar588 + auVar65 * auVar587 + auVar68 * ZEXT816(0x1000003d10);
            uVar1147 = auVar175._0_8_;
            auVar1003._8_8_ = 0;
            auVar1003._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            uVar1149 = local_11e0._8_8_ * 2;
            auVar69._8_8_ = 0;
            auVar69._0_8_ = local_11f8;
            auVar590._8_8_ = 0;
            auVar590._0_8_ = uVar1149;
            auVar70._8_8_ = 0;
            auVar70._0_8_ = auStack_11f0._0_8_ * 2;
            auVar591._8_8_ = 0;
            auVar591._0_8_ = local_11e0._0_8_;
            auVar71._8_8_ = 0;
            auVar71._0_8_ = auStack_11f0._8_8_;
            auVar592._8_8_ = 0;
            auVar592._0_8_ = auStack_11f0._8_8_;
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar1132 >> 0x34 | SUB168(auVar67 * auVar589,8) << 0xc;
            auVar175 = auVar69 * auVar590 + auVar1003 + auVar70 * auVar591 + auVar71 * auVar592 +
                       auVar72 * ZEXT816(0x1000003d10);
            uVar1132 = auVar175._0_8_;
            auVar1004._8_8_ = 0;
            auVar1004._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar73._8_8_ = 0;
            auVar73._0_8_ = local_11f8;
            auVar593._8_8_ = 0;
            auVar593._0_8_ = local_11f8;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = auStack_11f0._0_8_;
            auVar594._8_8_ = 0;
            auVar594._0_8_ = uVar1149;
            auVar75._8_8_ = 0;
            auVar75._0_8_ = auStack_11f0._8_8_ * 2;
            auVar595._8_8_ = 0;
            auVar595._0_8_ = local_11e0._0_8_;
            auVar175 = auVar74 * auVar594 + auVar1004 + auVar75 * auVar595;
            uVar1148 = auVar175._0_8_;
            auVar1006._8_8_ = 0;
            auVar1006._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar596._8_8_ = 0;
            auVar596._0_8_ =
                 (uVar1148 & 0xfffffffffffff) << 4 | (uVar1132 & 0xfffffffffffff) >> 0x30;
            uVar1148 = auVar505._0_8_;
            auVar505 = auVar73 * auVar593 + ZEXT816(0x1000003d1) * auVar596;
            local_10f0 = uVar1148 & 0xfffffffffffff;
            auVar1005._8_8_ = 0;
            auVar1005._0_8_ = uVar1148 >> 0x34 | auVar505._8_8_ << 0xc;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = local_11f8 * 2;
            auVar597._8_8_ = 0;
            auVar597._0_8_ = auStack_11f0._0_8_;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = auStack_11f0._8_8_;
            auVar598._8_8_ = 0;
            auVar598._0_8_ = uVar1149;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = local_11e0._0_8_;
            auVar599._8_8_ = 0;
            auVar599._0_8_ = local_11e0._0_8_;
            auVar1166 = auVar77 * auVar598 + auVar1006 + auVar78 * auVar599;
            uVar1148 = auVar1166._0_8_;
            auVar79._8_8_ = 0;
            auVar79._0_8_ = uVar1148 & 0xfffffffffffff;
            auVar175 = auVar76 * auVar597 + auVar1005 + auVar79 * ZEXT816(0x1000003d10);
            uVar1154 = auVar175._0_8_;
            auVar1008._8_8_ = 0;
            auVar1008._0_8_ = uVar1148 >> 0x34 | auVar1166._8_8_ << 0xc;
            local_10e8 = uVar1154 & 0xfffffffffffff;
            auVar1007._8_8_ = 0;
            auVar1007._0_8_ = uVar1154 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar80._8_8_ = 0;
            auVar80._0_8_ = local_11f8 * 2;
            auVar600._8_8_ = 0;
            auVar600._0_8_ = auStack_11f0._8_8_;
            auVar81._8_8_ = 0;
            auVar81._0_8_ = auStack_11f0._0_8_;
            auVar601._8_8_ = 0;
            auVar601._0_8_ = auStack_11f0._0_8_;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = local_11e0._0_8_;
            auVar602._8_8_ = 0;
            auVar602._0_8_ = uVar1149;
            auVar1008 = auVar82 * auVar602 + auVar1008;
            uVar1149 = auVar1008._0_8_;
            auVar83._8_8_ = 0;
            auVar83._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar80 * auVar600 + auVar1007 + auVar81 * auVar601 +
                       auVar83 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            local_10e0 = uVar1148 & 0xfffffffffffff;
            auVar1009._8_8_ = 0;
            auVar1009._0_8_ =
                 (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1147 & 0xfffffffffffff);
            auVar84._8_8_ = 0;
            auVar84._0_8_ = uVar1149 >> 0x34 | auVar1008._8_8_ << 0xc;
            auVar1009 = auVar84 * ZEXT816(0x1000003d10) + auVar1009;
            uVar1149 = auVar1009._0_8_;
            local_10d8 = uVar1149 & 0xfffffffffffff;
            local_10d0 = (uVar1149 >> 0x34 | auVar1009._8_8_ << 0xc) + (uVar1132 & 0xffffffffffff);
            auVar85._8_8_ = 0;
            auVar85._0_8_ = local_11f8;
            auVar603._8_8_ = 0;
            auVar603._0_8_ = local_10d8;
            auVar86._8_8_ = 0;
            auVar86._0_8_ = auStack_11f0._0_8_;
            auVar604._8_8_ = 0;
            auVar604._0_8_ = local_10e0;
            auVar87._8_8_ = 0;
            auVar87._0_8_ = auStack_11f0._8_8_;
            auVar605._8_8_ = 0;
            auVar605._0_8_ = local_10e8;
            auVar88._8_8_ = 0;
            auVar88._0_8_ = local_11e0._0_8_;
            auVar606._8_8_ = 0;
            auVar606._0_8_ = local_10f0;
            auVar89._8_8_ = 0;
            auVar89._0_8_ = local_11e0._8_8_;
            auVar607._8_8_ = 0;
            auVar607._0_8_ = local_10d0;
            uVar1149 = SUB168(auVar89 * auVar607,0);
            auVar90._8_8_ = 0;
            auVar90._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar86 * auVar604 + auVar85 * auVar603 + auVar87 * auVar605 +
                       auVar88 * auVar606 + auVar90 * ZEXT816(0x1000003d10);
            uVar1132 = auVar175._0_8_;
            auVar1010._8_8_ = 0;
            auVar1010._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar91._8_8_ = 0;
            auVar91._0_8_ = local_11f8;
            auVar608._8_8_ = 0;
            auVar608._0_8_ = local_10d0;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = auStack_11f0._0_8_;
            auVar609._8_8_ = 0;
            auVar609._0_8_ = local_10d8;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = auStack_11f0._8_8_;
            auVar610._8_8_ = 0;
            auVar610._0_8_ = local_10e0;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = local_11e0._0_8_;
            auVar611._8_8_ = 0;
            auVar611._0_8_ = local_10e8;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = local_11e0._8_8_;
            auVar612._8_8_ = 0;
            auVar612._0_8_ = local_10f0;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = uVar1149 >> 0x34 | SUB168(auVar89 * auVar607,8) << 0xc;
            auVar175 = auVar91 * auVar608 + auVar1010 + auVar92 * auVar609 + auVar93 * auVar610 +
                       auVar94 * auVar611 + auVar95 * auVar612 + auVar96 * ZEXT816(0x1000003d10);
            uVar1149 = auVar175._0_8_;
            auVar1011._8_8_ = 0;
            auVar1011._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = local_11f8;
            auVar613._8_8_ = 0;
            auVar613._0_8_ = local_10f0;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = auStack_11f0._0_8_;
            auVar614._8_8_ = 0;
            auVar614._0_8_ = local_10d0;
            auVar99._8_8_ = 0;
            auVar99._0_8_ = auStack_11f0._8_8_;
            auVar615._8_8_ = 0;
            auVar615._0_8_ = local_10d8;
            auVar100._8_8_ = 0;
            auVar100._0_8_ = local_11e0._0_8_;
            auVar616._8_8_ = 0;
            auVar616._0_8_ = local_10e0;
            auVar101._8_8_ = 0;
            auVar101._0_8_ = local_11e0._8_8_;
            auVar617._8_8_ = 0;
            auVar617._0_8_ = local_10e8;
            auVar175 = auVar98 * auVar614 + auVar1011 + auVar99 * auVar615 + auVar100 * auVar616 +
                       auVar101 * auVar617;
            uVar1147 = auVar175._0_8_;
            auVar1013._8_8_ = 0;
            auVar1013._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar618._8_8_ = 0;
            auVar618._0_8_ =
                 (uVar1147 & 0xfffffffffffff) << 4 | (uVar1149 & 0xfffffffffffff) >> 0x30;
            auVar175 = auVar97 * auVar613 + ZEXT816(0x1000003d1) * auVar618;
            uVar1147 = auVar175._0_8_;
            local_1140 = uVar1147 & 0xfffffffffffff;
            auVar1012._8_8_ = 0;
            auVar1012._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar102._8_8_ = 0;
            auVar102._0_8_ = local_11f8;
            auVar619._8_8_ = 0;
            auVar619._0_8_ = local_10e8;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = auStack_11f0._0_8_;
            auVar620._8_8_ = 0;
            auVar620._0_8_ = local_10f0;
            auVar104._8_8_ = 0;
            auVar104._0_8_ = auStack_11f0._8_8_;
            auVar621._8_8_ = 0;
            auVar621._0_8_ = local_10d0;
            auVar105._8_8_ = 0;
            auVar105._0_8_ = local_11e0._0_8_;
            auVar622._8_8_ = 0;
            auVar622._0_8_ = local_10d8;
            auVar106._8_8_ = 0;
            auVar106._0_8_ = local_11e0._8_8_;
            auVar623._8_8_ = 0;
            auVar623._0_8_ = local_10e0;
            auVar1166 = auVar104 * auVar621 + auVar1013 + auVar105 * auVar622 + auVar106 * auVar623;
            uVar1147 = auVar1166._0_8_;
            auVar107._8_8_ = 0;
            auVar107._0_8_ = uVar1147 & 0xfffffffffffff;
            auVar175 = auVar102 * auVar619 + auVar1012 + auVar103 * auVar620 +
                       auVar107 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            auVar1015._8_8_ = 0;
            auVar1015._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
            local_1138 = uVar1148 & 0xfffffffffffff;
            auVar1014._8_8_ = 0;
            auVar1014._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar108._8_8_ = 0;
            auVar108._0_8_ = local_11f8;
            auVar624._8_8_ = 0;
            auVar624._0_8_ = local_10e0;
            auVar109._8_8_ = 0;
            auVar109._0_8_ = auStack_11f0._0_8_;
            auVar625._8_8_ = 0;
            auVar625._0_8_ = local_10e8;
            auVar110._8_8_ = 0;
            auVar110._0_8_ = auStack_11f0._8_8_;
            auVar626._8_8_ = 0;
            auVar626._0_8_ = local_10f0;
            auVar111._8_8_ = 0;
            auVar111._0_8_ = local_11e0._0_8_;
            auVar627._8_8_ = 0;
            auVar627._0_8_ = local_10d0;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = local_11e0._8_8_;
            auVar628._8_8_ = 0;
            auVar628._0_8_ = local_10d8;
            auVar1166 = auVar111 * auVar627 + auVar1015 + auVar112 * auVar628;
            uVar1147 = auVar1166._0_8_;
            auVar113._8_8_ = 0;
            auVar113._0_8_ = uVar1147 & 0xfffffffffffff;
            auVar175 = auVar108 * auVar624 + auVar1014 + auVar109 * auVar625 + auVar110 * auVar626 +
                       auVar113 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            local_1130 = uVar1148 & 0xfffffffffffff;
            auVar1016._8_8_ = 0;
            auVar1016._0_8_ =
                 (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1132 & 0xfffffffffffff);
            auVar114._8_8_ = 0;
            auVar114._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
            auVar1016 = auVar114 * ZEXT816(0x1000003d10) + auVar1016;
            uVar1132 = auVar1016._0_8_;
            local_1128 = uVar1132 & 0xfffffffffffff;
            local_1120 = (uVar1132 >> 0x34 | auVar1016._8_8_ << 0xc) + (uVar1149 & 0xffffffffffff);
            auVar115._8_8_ = 0;
            auVar115._0_8_ = local_10f0;
            auVar629._8_8_ = 0;
            auVar629._0_8_ = local_1258.x.n[3];
            auVar116._8_8_ = 0;
            auVar116._0_8_ = local_10e8;
            auVar630._8_8_ = 0;
            auVar630._0_8_ = local_1258.x.n[2];
            auVar117._8_8_ = 0;
            auVar117._0_8_ = local_10e0;
            auVar631._8_8_ = 0;
            auVar631._0_8_ = local_1258.x.n[1];
            auVar118._8_8_ = 0;
            auVar118._0_8_ = local_10d8;
            auVar632._8_8_ = 0;
            auVar632._0_8_ = local_1258.x.n[0];
            auVar119._8_8_ = 0;
            auVar119._0_8_ = local_10d0;
            auVar633._8_8_ = 0;
            auVar633._0_8_ = local_1258.x.n[4];
            uVar1149 = SUB168(auVar119 * auVar633,0);
            auVar120._8_8_ = 0;
            auVar120._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar116 * auVar630 + auVar115 * auVar629 + auVar117 * auVar631 +
                       auVar118 * auVar632 + auVar120 * ZEXT816(0x1000003d10);
            uVar1132 = auVar175._0_8_;
            auVar1017._8_8_ = 0;
            auVar1017._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar121._8_8_ = 0;
            auVar121._0_8_ = local_10f0;
            auVar634._8_8_ = 0;
            auVar634._0_8_ = local_1258.x.n[4];
            auVar122._8_8_ = 0;
            auVar122._0_8_ = local_10e8;
            auVar635._8_8_ = 0;
            auVar635._0_8_ = local_1258.x.n[3];
            auVar123._8_8_ = 0;
            auVar123._0_8_ = local_10e0;
            auVar636._8_8_ = 0;
            auVar636._0_8_ = local_1258.x.n[2];
            auVar124._8_8_ = 0;
            auVar124._0_8_ = local_10d8;
            auVar637._8_8_ = 0;
            auVar637._0_8_ = local_1258.x.n[1];
            auVar125._8_8_ = 0;
            auVar125._0_8_ = local_10d0;
            auVar638._8_8_ = 0;
            auVar638._0_8_ = local_1258.x.n[0];
            auVar126._8_8_ = 0;
            auVar126._0_8_ = uVar1149 >> 0x34 | SUB168(auVar119 * auVar633,8) << 0xc;
            auVar175 = auVar121 * auVar634 + auVar1017 + auVar122 * auVar635 + auVar123 * auVar636 +
                       auVar124 * auVar637 + auVar125 * auVar638 + auVar126 * ZEXT816(0x1000003d10);
            uVar1149 = auVar175._0_8_;
            auVar1018._8_8_ = 0;
            auVar1018._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar127._8_8_ = 0;
            auVar127._0_8_ = local_10f0;
            auVar639._8_8_ = 0;
            auVar639._0_8_ = local_1258.x.n[0];
            auVar128._8_8_ = 0;
            auVar128._0_8_ = local_10e8;
            auVar640._8_8_ = 0;
            auVar640._0_8_ = local_1258.x.n[4];
            auVar129._8_8_ = 0;
            auVar129._0_8_ = local_10e0;
            auVar641._8_8_ = 0;
            auVar641._0_8_ = local_1258.x.n[3];
            auVar130._8_8_ = 0;
            auVar130._0_8_ = local_10d8;
            auVar642._8_8_ = 0;
            auVar642._0_8_ = local_1258.x.n[2];
            auVar131._8_8_ = 0;
            auVar131._0_8_ = local_10d0;
            auVar643._8_8_ = 0;
            auVar643._0_8_ = local_1258.x.n[1];
            auVar175 = auVar128 * auVar640 + auVar1018 + auVar129 * auVar641 + auVar130 * auVar642 +
                       auVar131 * auVar643;
            uVar1147 = auVar175._0_8_;
            auVar1020._8_8_ = 0;
            auVar1020._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar644._8_8_ = 0;
            auVar644._0_8_ =
                 (uVar1147 & 0xfffffffffffff) << 4 | (uVar1149 & 0xfffffffffffff) >> 0x30;
            auVar175 = auVar127 * auVar639 + ZEXT816(0x1000003d1) * auVar644;
            uVar1147 = auVar175._0_8_;
            (r->x).n[0] = uVar1147 & 0xfffffffffffff;
            auVar1019._8_8_ = 0;
            auVar1019._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar132._8_8_ = 0;
            auVar132._0_8_ = local_10f0;
            auVar645._8_8_ = 0;
            auVar645._0_8_ = local_1258.x.n[1];
            auVar133._8_8_ = 0;
            auVar133._0_8_ = local_10e8;
            auVar646._8_8_ = 0;
            auVar646._0_8_ = local_1258.x.n[0];
            auVar134._8_8_ = 0;
            auVar134._0_8_ = local_10e0;
            auVar647._8_8_ = 0;
            auVar647._0_8_ = local_1258.x.n[4];
            auVar135._8_8_ = 0;
            auVar135._0_8_ = local_10d8;
            auVar648._8_8_ = 0;
            auVar648._0_8_ = local_1258.x.n[3];
            auVar136._8_8_ = 0;
            auVar136._0_8_ = local_10d0;
            auVar649._8_8_ = 0;
            auVar649._0_8_ = local_1258.x.n[2];
            auVar1166 = auVar134 * auVar647 + auVar1020 + auVar135 * auVar648 + auVar136 * auVar649;
            uVar1147 = auVar1166._0_8_;
            auVar137._8_8_ = 0;
            auVar137._0_8_ = uVar1147 & 0xfffffffffffff;
            auVar175 = auVar132 * auVar645 + auVar1019 + auVar133 * auVar646 +
                       auVar137 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            auVar1022._8_8_ = 0;
            auVar1022._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
            (r->x).n[1] = uVar1148 & 0xfffffffffffff;
            auVar1021._8_8_ = 0;
            auVar1021._0_8_ = uVar1148 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar138._8_8_ = 0;
            auVar138._0_8_ = local_10f0;
            auVar650._8_8_ = 0;
            auVar650._0_8_ = local_1258.x.n[2];
            auVar139._8_8_ = 0;
            auVar139._0_8_ = local_10e8;
            auVar651._8_8_ = 0;
            auVar651._0_8_ = local_1258.x.n[1];
            auVar140._8_8_ = 0;
            auVar140._0_8_ = local_10e0;
            auVar652._8_8_ = 0;
            auVar652._0_8_ = local_1258.x.n[0];
            auVar141._8_8_ = 0;
            auVar141._0_8_ = local_10d8;
            auVar653._8_8_ = 0;
            auVar653._0_8_ = local_1258.x.n[4];
            auVar142._8_8_ = 0;
            auVar142._0_8_ = local_10d0;
            auVar654._8_8_ = 0;
            auVar654._0_8_ = local_1258.x.n[3];
            auVar1166 = auVar141 * auVar653 + auVar1022 + auVar142 * auVar654;
            uVar1147 = auVar1166._0_8_;
            auVar143._8_8_ = 0;
            auVar143._0_8_ = uVar1147 & 0xfffffffffffff;
            auVar175 = auVar138 * auVar650 + auVar1021 + auVar139 * auVar651 + auVar140 * auVar652 +
                       auVar143 * ZEXT816(0x1000003d10);
            uVar1148 = auVar175._0_8_;
            (r->x).n[2] = uVar1148 & 0xfffffffffffff;
            auVar1023._8_8_ = 0;
            auVar1023._0_8_ =
                 (uVar1148 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1132 & 0xfffffffffffff);
            auVar144._8_8_ = 0;
            auVar144._0_8_ = uVar1147 >> 0x34 | auVar1166._8_8_ << 0xc;
            auVar1023 = auVar144 * ZEXT816(0x1000003d10) + auVar1023;
            uVar1132 = auVar1023._0_8_;
            (r->x).n[3] = uVar1132 & 0xfffffffffffff;
            (r->x).n[4] = (uVar1132 >> 0x34 | auVar1023._8_8_ << 0xc) + (uVar1149 & 0xffffffffffff);
            auVar145._8_8_ = 0;
            auVar145._0_8_ = local_1140;
            auVar655._8_8_ = 0;
            auVar655._0_8_ = local_1258.y.n[3];
            auVar146._8_8_ = 0;
            auVar146._0_8_ = local_1138;
            auVar656._8_8_ = 0;
            auVar656._0_8_ = local_1258.y.n[2];
            auVar147._8_8_ = 0;
            auVar147._0_8_ = local_1130;
            auVar657._8_8_ = 0;
            auVar657._0_8_ = local_1258.y.n[1];
            auVar148._8_8_ = 0;
            auVar148._0_8_ = local_1128;
            auVar658._8_8_ = 0;
            auVar658._0_8_ = local_1258.y.n[0];
            auVar149._8_8_ = 0;
            auVar149._0_8_ = local_1120;
            auVar659._8_8_ = 0;
            auVar659._0_8_ = local_1258.y.n[4];
            uVar1149 = SUB168(auVar149 * auVar659,0);
            auVar150._8_8_ = 0;
            auVar150._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar146 * auVar656 + auVar145 * auVar655 + auVar147 * auVar657 +
                       auVar148 * auVar658 + auVar150 * ZEXT816(0x1000003d10);
            uVar1132 = auVar175._0_8_;
            auVar1024._8_8_ = 0;
            auVar1024._0_8_ = uVar1132 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar151._8_8_ = 0;
            auVar151._0_8_ = local_1140;
            auVar660._8_8_ = 0;
            auVar660._0_8_ = local_1258.y.n[4];
            auVar152._8_8_ = 0;
            auVar152._0_8_ = local_1138;
            auVar661._8_8_ = 0;
            auVar661._0_8_ = local_1258.y.n[3];
            auVar153._8_8_ = 0;
            auVar153._0_8_ = local_1130;
            auVar662._8_8_ = 0;
            auVar662._0_8_ = local_1258.y.n[2];
            auVar154._8_8_ = 0;
            auVar154._0_8_ = local_1128;
            auVar663._8_8_ = 0;
            auVar663._0_8_ = local_1258.y.n[1];
            auVar155._8_8_ = 0;
            auVar155._0_8_ = local_1120;
            auVar664._8_8_ = 0;
            auVar664._0_8_ = local_1258.y.n[0];
            auVar156._8_8_ = 0;
            auVar156._0_8_ = uVar1149 >> 0x34 | SUB168(auVar149 * auVar659,8) << 0xc;
            auVar175 = auVar151 * auVar660 + auVar1024 + auVar152 * auVar661 + auVar153 * auVar662 +
                       auVar154 * auVar663 + auVar155 * auVar664 + auVar156 * ZEXT816(0x1000003d10);
            uVar1149 = auVar175._0_8_;
            auVar1025._8_8_ = 0;
            auVar1025._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
            local_1280 = uVar1149 & 0xffffffffffff;
            auVar157._8_8_ = 0;
            auVar157._0_8_ = local_1140;
            auVar665._8_8_ = 0;
            auVar665._0_8_ = local_1258.y.n[0];
            auVar158._8_8_ = 0;
            auVar158._0_8_ = local_1138;
            auVar666._8_8_ = 0;
            auVar666._0_8_ = local_1258.y.n[4];
            auVar159._8_8_ = 0;
            auVar159._0_8_ = local_1130;
            auVar667._8_8_ = 0;
            auVar667._0_8_ = local_1258.y.n[3];
            auVar160._8_8_ = 0;
            auVar160._0_8_ = local_1128;
            auVar668._8_8_ = 0;
            auVar668._0_8_ = local_1258.y.n[2];
            auVar161._8_8_ = 0;
            auVar161._0_8_ = local_1120;
            auVar669._8_8_ = 0;
            auVar669._0_8_ = local_1258.y.n[1];
            auVar175 = auVar158 * auVar666 + auVar1025 + auVar159 * auVar667 + auVar160 * auVar668 +
                       auVar161 * auVar669;
            uVar1147 = auVar175._0_8_;
            auVar1027._8_8_ = 0;
            auVar1027._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar670._8_8_ = 0;
            auVar670._0_8_ =
                 (uVar1147 & 0xfffffffffffff) << 4 | (uVar1149 & 0xfffffffffffff) >> 0x30;
            auVar175 = auVar157 * auVar665 + ZEXT816(0x1000003d1) * auVar670;
            uVar1149 = auVar175._0_8_;
            psVar1->n[0] = uVar1149 & 0xfffffffffffff;
            auVar1026._8_8_ = 0;
            auVar1026._0_8_ = uVar1149 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar162._8_8_ = 0;
            auVar162._0_8_ = local_1140;
            auVar671._8_8_ = 0;
            auVar671._0_8_ = local_1258.y.n[1];
            auVar163._8_8_ = 0;
            auVar163._0_8_ = local_1138;
            auVar672._8_8_ = 0;
            auVar672._0_8_ = local_1258.y.n[0];
            auVar164._8_8_ = 0;
            auVar164._0_8_ = local_1130;
            auVar673._8_8_ = 0;
            auVar673._0_8_ = local_1258.y.n[4];
            auVar165._8_8_ = 0;
            auVar165._0_8_ = local_1128;
            auVar674._8_8_ = 0;
            auVar674._0_8_ = local_1258.y.n[3];
            auVar166._8_8_ = 0;
            auVar166._0_8_ = local_1120;
            auVar675._8_8_ = 0;
            auVar675._0_8_ = local_1258.y.n[2];
            auVar1166 = auVar164 * auVar673 + auVar1027 + auVar165 * auVar674 + auVar166 * auVar675;
            uVar1149 = auVar1166._0_8_;
            auVar167._8_8_ = 0;
            auVar167._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar162 * auVar671 + auVar1026 + auVar163 * auVar672 +
                       auVar167 * ZEXT816(0x1000003d10);
            uVar1147 = auVar175._0_8_;
            auVar1029._8_8_ = 0;
            auVar1029._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
            (r->y).n[1] = uVar1147 & 0xfffffffffffff;
            auVar1028._8_8_ = 0;
            auVar1028._0_8_ = uVar1147 >> 0x34 | auVar175._8_8_ << 0xc;
            auVar168._8_8_ = 0;
            auVar168._0_8_ = local_1140;
            auVar676._8_8_ = 0;
            auVar676._0_8_ = local_1258.y.n[2];
            auVar169._8_8_ = 0;
            auVar169._0_8_ = local_1138;
            auVar677._8_8_ = 0;
            auVar677._0_8_ = local_1258.y.n[1];
            auVar170._8_8_ = 0;
            auVar170._0_8_ = local_1130;
            auVar678._8_8_ = 0;
            auVar678._0_8_ = local_1258.y.n[0];
            auVar171._8_8_ = 0;
            auVar171._0_8_ = local_1128;
            auVar679._8_8_ = 0;
            auVar679._0_8_ = local_1258.y.n[4];
            auVar172._8_8_ = 0;
            auVar172._0_8_ = local_1120;
            auVar680._8_8_ = 0;
            auVar680._0_8_ = local_1258.y.n[3];
            auVar1166 = auVar171 * auVar679 + auVar1029 + auVar172 * auVar680;
            uVar1149 = auVar1166._0_8_;
            auVar173._8_8_ = 0;
            auVar173._0_8_ = uVar1149 & 0xfffffffffffff;
            auVar175 = auVar168 * auVar676 + auVar1028 + auVar169 * auVar677 + auVar170 * auVar678 +
                       auVar173 * ZEXT816(0x1000003d10);
            uVar1147 = auVar175._0_8_;
            (r->y).n[2] = uVar1147 & 0xfffffffffffff;
            auVar1030._8_8_ = 0;
            auVar1030._0_8_ =
                 (uVar1147 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1132 & 0xfffffffffffff);
            auVar174._8_8_ = 0;
            auVar174._0_8_ = uVar1149 >> 0x34 | auVar1166._8_8_ << 0xc;
            auVar1030 = auVar174 * ZEXT816(0x1000003d10) + auVar1030;
            uVar1149 = auVar1030._0_8_;
            (r->y).n[3] = uVar1149 & 0xfffffffffffff;
            (r->y).n[4] = (uVar1149 >> 0x34 | auVar1030._8_8_ << 0xc) + local_1280;
            (r->z).n[0] = 1;
            local_1150[2] = 0;
            local_1150[3] = 0;
            local_1150[0] = 0;
            local_1150[1] = 0;
          }
        }
      }
      bVar4 = 1 < uVar1141;
      uVar1141 = uVar1141 - 1;
    } while (bVar4);
    if (r->infinity == 0) {
      uVar1141 = psVar2->n[0];
      uVar1149 = (r->z).n[1];
      uVar1132 = (r->z).n[2];
      uVar1147 = (r->z).n[3];
      uVar1148 = (r->z).n[4];
      auVar505._8_8_ = 0;
      auVar505._0_8_ = local_11f8;
      auVar963._8_8_ = 0;
      auVar963._0_8_ = uVar1147;
      auVar506._8_8_ = 0;
      auVar506._0_8_ = auStack_11f0._0_8_;
      auVar964._8_8_ = 0;
      auVar964._0_8_ = uVar1132;
      auVar507._8_8_ = 0;
      auVar507._0_8_ = auStack_11f0._8_8_;
      auVar965._8_8_ = 0;
      auVar965._0_8_ = uVar1149;
      auVar508._8_8_ = 0;
      auVar508._0_8_ = local_11e0._0_8_;
      auVar966._8_8_ = 0;
      auVar966._0_8_ = uVar1141;
      auVar509._8_8_ = 0;
      auVar509._0_8_ = local_11e0._8_8_;
      auVar967._8_8_ = 0;
      auVar967._0_8_ = uVar1148;
      uVar1154 = SUB168(auVar509 * auVar967,0);
      auVar510._8_8_ = 0;
      auVar510._0_8_ = uVar1154 & 0xfffffffffffff;
      auVar175 = auVar506 * auVar964 + auVar505 * auVar963 + auVar507 * auVar965 +
                 auVar508 * auVar966 + auVar510 * ZEXT816(0x1000003d10);
      uVar1139 = auVar175._0_8_;
      auVar1115._8_8_ = 0;
      auVar1115._0_8_ = uVar1139 >> 0x34 | auVar175._8_8_ << 0xc;
      auVar511._8_8_ = 0;
      auVar511._0_8_ = local_11f8;
      auVar968._8_8_ = 0;
      auVar968._0_8_ = uVar1148;
      auVar512._8_8_ = 0;
      auVar512._0_8_ = auStack_11f0._0_8_;
      auVar969._8_8_ = 0;
      auVar969._0_8_ = uVar1147;
      auVar513._8_8_ = 0;
      auVar513._0_8_ = auStack_11f0._8_8_;
      auVar970._8_8_ = 0;
      auVar970._0_8_ = uVar1132;
      auVar514._8_8_ = 0;
      auVar514._0_8_ = local_11e0._0_8_;
      auVar971._8_8_ = 0;
      auVar971._0_8_ = uVar1149;
      auVar515._8_8_ = 0;
      auVar515._0_8_ = local_11e0._8_8_;
      auVar972._8_8_ = 0;
      auVar972._0_8_ = uVar1141;
      auVar516._8_8_ = 0;
      auVar516._0_8_ = uVar1154 >> 0x34 | SUB168(auVar509 * auVar967,8) << 0xc;
      auVar175 = auVar511 * auVar968 + auVar1115 + auVar512 * auVar969 + auVar513 * auVar970 +
                 auVar514 * auVar971 + auVar515 * auVar972 + auVar516 * ZEXT816(0x1000003d10);
      uVar1154 = auVar175._0_8_;
      auVar1117._8_8_ = 0;
      auVar1117._0_8_ = uVar1154 >> 0x34 | auVar175._8_8_ << 0xc;
      auVar517._8_8_ = 0;
      auVar517._0_8_ = local_11f8;
      auVar973._8_8_ = 0;
      auVar973._0_8_ = uVar1141;
      auVar518._8_8_ = 0;
      auVar518._0_8_ = auStack_11f0._0_8_;
      auVar974._8_8_ = 0;
      auVar974._0_8_ = uVar1148;
      auVar519._8_8_ = 0;
      auVar519._0_8_ = auStack_11f0._8_8_;
      auVar975._8_8_ = 0;
      auVar975._0_8_ = uVar1147;
      auVar520._8_8_ = 0;
      auVar520._0_8_ = local_11e0._0_8_;
      auVar976._8_8_ = 0;
      auVar976._0_8_ = uVar1132;
      auVar521._8_8_ = 0;
      auVar521._0_8_ = local_11e0._8_8_;
      auVar977._8_8_ = 0;
      auVar977._0_8_ = uVar1149;
      auVar175 = auVar518 * auVar974 + auVar1117 + auVar519 * auVar975 + auVar520 * auVar976 +
                 auVar521 * auVar977;
      uVar1140 = auVar175._0_8_;
      auVar1119._8_8_ = 0;
      auVar1119._0_8_ = uVar1140 >> 0x34 | auVar175._8_8_ << 0xc;
      auVar978._8_8_ = 0;
      auVar978._0_8_ = (uVar1140 & 0xfffffffffffff) << 4 | (uVar1154 & 0xfffffffffffff) >> 0x30;
      uVar1140 = auVar1116._0_8_;
      auVar1116 = auVar517 * auVar973 + ZEXT816(0x1000003d1) * auVar978;
      psVar2->n[0] = uVar1140 & 0xfffffffffffff;
      auVar1118._8_8_ = 0;
      auVar1118._0_8_ = uVar1140 >> 0x34 | auVar1116._8_8_ << 0xc;
      auVar522._8_8_ = 0;
      auVar522._0_8_ = local_11f8;
      auVar979._8_8_ = 0;
      auVar979._0_8_ = uVar1149;
      auVar523._8_8_ = 0;
      auVar523._0_8_ = auStack_11f0._0_8_;
      auVar980._8_8_ = 0;
      auVar980._0_8_ = uVar1141;
      auVar524._8_8_ = 0;
      auVar524._0_8_ = auStack_11f0._8_8_;
      auVar981._8_8_ = 0;
      auVar981._0_8_ = uVar1148;
      auVar525._8_8_ = 0;
      auVar525._0_8_ = local_11e0._0_8_;
      auVar982._8_8_ = 0;
      auVar982._0_8_ = uVar1147;
      auVar526._8_8_ = 0;
      auVar526._0_8_ = local_11e0._8_8_;
      auVar983._8_8_ = 0;
      auVar983._0_8_ = uVar1132;
      auVar505 = auVar524 * auVar981 + auVar1119 + auVar525 * auVar982 + auVar526 * auVar983;
      uVar1140 = auVar505._0_8_;
      auVar527._8_8_ = 0;
      auVar527._0_8_ = uVar1140 & 0xfffffffffffff;
      auVar175 = auVar522 * auVar979 + auVar1118 + auVar523 * auVar980 +
                 auVar527 * ZEXT816(0x1000003d10);
      uVar1162 = auVar175._0_8_;
      auVar1121._8_8_ = 0;
      auVar1121._0_8_ = uVar1140 >> 0x34 | auVar505._8_8_ << 0xc;
      (r->z).n[1] = uVar1162 & 0xfffffffffffff;
      auVar1120._8_8_ = 0;
      auVar1120._0_8_ = uVar1162 >> 0x34 | auVar175._8_8_ << 0xc;
      auVar528._8_8_ = 0;
      auVar528._0_8_ = local_11f8;
      auVar984._8_8_ = 0;
      auVar984._0_8_ = uVar1132;
      auVar529._8_8_ = 0;
      auVar529._0_8_ = auStack_11f0._0_8_;
      auVar985._8_8_ = 0;
      auVar985._0_8_ = uVar1149;
      auVar530._8_8_ = 0;
      auVar530._0_8_ = auStack_11f0._8_8_;
      auVar986._8_8_ = 0;
      auVar986._0_8_ = uVar1141;
      auVar531._8_8_ = 0;
      auVar531._0_8_ = local_11e0._0_8_;
      auVar987._8_8_ = 0;
      auVar987._0_8_ = uVar1148;
      auVar532._8_8_ = 0;
      auVar532._0_8_ = local_11e0._8_8_;
      auVar988._8_8_ = 0;
      auVar988._0_8_ = uVar1147;
      auVar505 = auVar531 * auVar987 + auVar1121 + auVar532 * auVar988;
      uVar1141 = auVar505._0_8_;
      auVar533._8_8_ = 0;
      auVar533._0_8_ = uVar1141 & 0xfffffffffffff;
      auVar175 = auVar528 * auVar984 + auVar1120 + auVar529 * auVar985 + auVar530 * auVar986 +
                 auVar533 * ZEXT816(0x1000003d10);
      uVar1149 = auVar175._0_8_;
      (r->z).n[2] = uVar1149 & 0xfffffffffffff;
      auVar1122._8_8_ = 0;
      auVar1122._0_8_ = (uVar1149 >> 0x34 | auVar175._8_8_ << 0xc) + (uVar1139 & 0xfffffffffffff);
      auVar534._8_8_ = 0;
      auVar534._0_8_ = uVar1141 >> 0x34 | auVar505._8_8_ << 0xc;
      auVar1122 = auVar534 * ZEXT816(0x1000003d10) + auVar1122;
      uVar1141 = auVar1122._0_8_;
      (r->z).n[3] = uVar1141 & 0xfffffffffffff;
      (r->z).n[4] = (uVar1141 >> 0x34 | auVar1122._8_8_ << 0xc) + (uVar1154 & 0xffffffffffff);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult(const secp256k1_ecmult_context *ctx, secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_gej prej[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_fe zr[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
#ifdef USE_ENDOMORPHISM
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
#endif
    struct secp256k1_strauss_state state;

    state.prej = prej;
    state.zr = zr;
    state.pre_a = pre_a;
#ifdef USE_ENDOMORPHISM
    state.pre_a_lam = pre_a_lam;
#endif
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(ctx, &state, r, 1, a, na, ng);
}